

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float t1;
  undefined4 uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vfloat4 b0;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vfloat4 b0_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vfloat4 a0_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar212;
  float fVar213;
  vfloat4 a0_1;
  undefined1 auVar203 [16];
  float fVar214;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar222;
  float fVar223;
  vfloat4 a0;
  float fVar224;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  uint auStack_318 [4];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar30;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar229 [32];
  
  PVar5 = prim[1];
  uVar36 = (ulong)(byte)PVar5;
  fVar118 = *(float *)(prim + uVar36 * 0x19 + 0x12);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar43 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar109 = vsubps_avx(auVar41,*(undefined1 (*) [16])(prim + uVar36 * 0x19 + 6));
  fVar117 = fVar118 * auVar109._0_4_;
  fVar100 = fVar118 * auVar43._0_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar36 * 4 + 6);
  auVar72 = vpmovsxbd_avx2(auVar41);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar36 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar51);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar36 * 6 + 6);
  auVar73 = vpmovsxbd_avx2(auVar3);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar36 * 0xb + 6);
  auVar83 = vpmovsxbd_avx2(auVar50);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar77 = vpmovsxbd_avx2(auVar49);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar77);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar36 + 6);
  auVar71 = vpmovsxbd_avx2(auVar48);
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar35 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar74 = vpmovsxbd_avx2(auVar52);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar35 + uVar36 + 6);
  auVar75 = vpmovsxbd_avx2(auVar47);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar29 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar69 = vpmovsxbd_avx2(auVar4);
  auVar76 = vcvtdq2ps_avx(auVar69);
  auVar141._4_4_ = fVar100;
  auVar141._0_4_ = fVar100;
  auVar141._8_4_ = fVar100;
  auVar141._12_4_ = fVar100;
  auVar141._16_4_ = fVar100;
  auVar141._20_4_ = fVar100;
  auVar141._24_4_ = fVar100;
  auVar141._28_4_ = fVar100;
  auVar235._8_4_ = 1;
  auVar235._0_8_ = 0x100000001;
  auVar235._12_4_ = 1;
  auVar235._16_4_ = 1;
  auVar235._20_4_ = 1;
  auVar235._24_4_ = 1;
  auVar235._28_4_ = 1;
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar243 = ZEXT3264(auVar67);
  auVar79 = ZEXT1632(CONCAT412(fVar118 * auVar43._12_4_,
                               CONCAT48(fVar118 * auVar43._8_4_,
                                        CONCAT44(fVar118 * auVar43._4_4_,fVar100))));
  auVar78 = vpermps_avx2(auVar235,auVar79);
  auVar68 = vpermps_avx512vl(auVar67,auVar79);
  fVar100 = auVar68._0_4_;
  fVar191 = auVar68._4_4_;
  auVar79._4_4_ = fVar191 * auVar73._4_4_;
  auVar79._0_4_ = fVar100 * auVar73._0_4_;
  fVar200 = auVar68._8_4_;
  auVar79._8_4_ = fVar200 * auVar73._8_4_;
  fVar201 = auVar68._12_4_;
  auVar79._12_4_ = fVar201 * auVar73._12_4_;
  fVar105 = auVar68._16_4_;
  auVar79._16_4_ = fVar105 * auVar73._16_4_;
  fVar106 = auVar68._20_4_;
  auVar79._20_4_ = fVar106 * auVar73._20_4_;
  fVar107 = auVar68._24_4_;
  auVar79._24_4_ = fVar107 * auVar73._24_4_;
  auVar79._28_4_ = auVar77._28_4_;
  auVar77._4_4_ = auVar71._4_4_ * fVar191;
  auVar77._0_4_ = auVar71._0_4_ * fVar100;
  auVar77._8_4_ = auVar71._8_4_ * fVar200;
  auVar77._12_4_ = auVar71._12_4_ * fVar201;
  auVar77._16_4_ = auVar71._16_4_ * fVar105;
  auVar77._20_4_ = auVar71._20_4_ * fVar106;
  auVar77._24_4_ = auVar71._24_4_ * fVar107;
  auVar77._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar76._4_4_ * fVar191;
  auVar69._0_4_ = auVar76._0_4_ * fVar100;
  auVar69._8_4_ = auVar76._8_4_ * fVar200;
  auVar69._12_4_ = auVar76._12_4_ * fVar201;
  auVar69._16_4_ = auVar76._16_4_ * fVar105;
  auVar69._20_4_ = auVar76._20_4_ * fVar106;
  auVar69._24_4_ = auVar76._24_4_ * fVar107;
  auVar69._28_4_ = auVar68._28_4_;
  auVar41 = vfmadd231ps_fma(auVar79,auVar78,auVar70);
  auVar51 = vfmadd231ps_fma(auVar77,auVar78,auVar84);
  auVar3 = vfmadd231ps_fma(auVar69,auVar75,auVar78);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar141,auVar72);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar141,auVar83);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar74,auVar141);
  auVar221._4_4_ = fVar117;
  auVar221._0_4_ = fVar117;
  auVar221._8_4_ = fVar117;
  auVar221._12_4_ = fVar117;
  auVar221._16_4_ = fVar117;
  auVar221._20_4_ = fVar117;
  auVar221._24_4_ = fVar117;
  auVar221._28_4_ = fVar117;
  auVar69 = ZEXT1632(CONCAT412(fVar118 * auVar109._12_4_,
                               CONCAT48(fVar118 * auVar109._8_4_,
                                        CONCAT44(fVar118 * auVar109._4_4_,fVar117))));
  auVar77 = vpermps_avx2(auVar235,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  fVar118 = auVar69._0_4_;
  fVar100 = auVar69._4_4_;
  auVar78._4_4_ = fVar100 * auVar73._4_4_;
  auVar78._0_4_ = fVar118 * auVar73._0_4_;
  fVar191 = auVar69._8_4_;
  auVar78._8_4_ = fVar191 * auVar73._8_4_;
  fVar200 = auVar69._12_4_;
  auVar78._12_4_ = fVar200 * auVar73._12_4_;
  fVar201 = auVar69._16_4_;
  auVar78._16_4_ = fVar201 * auVar73._16_4_;
  fVar105 = auVar69._20_4_;
  auVar78._20_4_ = fVar105 * auVar73._20_4_;
  fVar106 = auVar69._24_4_;
  auVar78._24_4_ = fVar106 * auVar73._24_4_;
  auVar78._28_4_ = 1;
  auVar67._4_4_ = auVar71._4_4_ * fVar100;
  auVar67._0_4_ = auVar71._0_4_ * fVar118;
  auVar67._8_4_ = auVar71._8_4_ * fVar191;
  auVar67._12_4_ = auVar71._12_4_ * fVar200;
  auVar67._16_4_ = auVar71._16_4_ * fVar201;
  auVar67._20_4_ = auVar71._20_4_ * fVar105;
  auVar67._24_4_ = auVar71._24_4_ * fVar106;
  auVar67._28_4_ = auVar73._28_4_;
  auVar71._4_4_ = auVar76._4_4_ * fVar100;
  auVar71._0_4_ = auVar76._0_4_ * fVar118;
  auVar71._8_4_ = auVar76._8_4_ * fVar191;
  auVar71._12_4_ = auVar76._12_4_ * fVar200;
  auVar71._16_4_ = auVar76._16_4_ * fVar201;
  auVar71._20_4_ = auVar76._20_4_ * fVar105;
  auVar71._24_4_ = auVar76._24_4_ * fVar106;
  auVar71._28_4_ = auVar69._28_4_;
  auVar50 = vfmadd231ps_fma(auVar78,auVar77,auVar70);
  auVar49 = vfmadd231ps_fma(auVar67,auVar77,auVar84);
  auVar48 = vfmadd231ps_fma(auVar71,auVar77,auVar75);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar221,auVar72);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar221,auVar83);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar221,auVar74);
  auVar72 = vandps_avx(ZEXT1632(auVar41),auVar86);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar129._16_4_ = 0x219392ef;
  auVar129._20_4_ = 0x219392ef;
  auVar129._24_4_ = 0x219392ef;
  auVar129._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar72,auVar129,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar68._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar41._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar51),auVar86);
  uVar35 = vcmpps_avx512vl(auVar72,auVar129,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar80._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar51._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar3),auVar86);
  uVar35 = vcmpps_avx512vl(auVar72,auVar129,1);
  bVar39 = (bool)((byte)uVar35 & 1);
  auVar72._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar3._0_4_;
  bVar39 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar3._4_4_;
  bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar3._8_4_;
  bVar39 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * auVar3._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar41 = vfnmadd213ps_fma(auVar68,auVar70,auVar87);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar80);
  auVar51 = vfnmadd213ps_fma(auVar80,auVar70,auVar87);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar72);
  auVar3 = vfnmadd213ps_fma(auVar72,auVar70,auVar87);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar70,auVar70);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 7 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar50));
  auVar74._4_4_ = auVar41._4_4_ * auVar72._4_4_;
  auVar74._0_4_ = auVar41._0_4_ * auVar72._0_4_;
  auVar74._8_4_ = auVar41._8_4_ * auVar72._8_4_;
  auVar74._12_4_ = auVar41._12_4_ * auVar72._12_4_;
  auVar74._16_4_ = auVar72._16_4_ * 0.0;
  auVar74._20_4_ = auVar72._20_4_ * 0.0;
  auVar74._24_4_ = auVar72._24_4_ * 0.0;
  auVar74._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 9 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar50));
  auVar71 = vpbroadcastd_avx512vl();
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar85._0_4_ = auVar41._0_4_ * auVar72._0_4_;
  auVar85._4_4_ = auVar41._4_4_ * auVar72._4_4_;
  auVar85._8_4_ = auVar41._8_4_ * auVar72._8_4_;
  auVar85._12_4_ = auVar41._12_4_ * auVar72._12_4_;
  auVar85._16_4_ = auVar72._16_4_ * 0.0;
  auVar85._20_4_ = auVar72._20_4_ * 0.0;
  auVar85._24_4_ = auVar72._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar36 * -2 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar49));
  auVar75._4_4_ = auVar51._4_4_ * auVar72._4_4_;
  auVar75._0_4_ = auVar51._0_4_ * auVar72._0_4_;
  auVar75._8_4_ = auVar51._8_4_ * auVar72._8_4_;
  auVar75._12_4_ = auVar51._12_4_ * auVar72._12_4_;
  auVar75._16_4_ = auVar72._16_4_ * 0.0;
  auVar75._20_4_ = auVar72._20_4_ * 0.0;
  auVar75._24_4_ = auVar72._24_4_ * 0.0;
  auVar75._28_4_ = auVar72._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar49));
  auVar82._0_4_ = auVar51._0_4_ * auVar72._0_4_;
  auVar82._4_4_ = auVar51._4_4_ * auVar72._4_4_;
  auVar82._8_4_ = auVar51._8_4_ * auVar72._8_4_;
  auVar82._12_4_ = auVar51._12_4_ * auVar72._12_4_;
  auVar82._16_4_ = auVar72._16_4_ * 0.0;
  auVar82._20_4_ = auVar72._20_4_ * 0.0;
  auVar82._24_4_ = auVar72._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + uVar36 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar48));
  auVar76._4_4_ = auVar72._4_4_ * auVar3._4_4_;
  auVar76._0_4_ = auVar72._0_4_ * auVar3._0_4_;
  auVar76._8_4_ = auVar72._8_4_ * auVar3._8_4_;
  auVar76._12_4_ = auVar72._12_4_ * auVar3._12_4_;
  auVar76._16_4_ = auVar72._16_4_ * 0.0;
  auVar76._20_4_ = auVar72._20_4_ * 0.0;
  auVar76._24_4_ = auVar72._24_4_ * 0.0;
  auVar76._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0x17 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar48));
  auVar81._0_4_ = auVar3._0_4_ * auVar72._0_4_;
  auVar81._4_4_ = auVar3._4_4_ * auVar72._4_4_;
  auVar81._8_4_ = auVar3._8_4_ * auVar72._8_4_;
  auVar81._12_4_ = auVar3._12_4_ * auVar72._12_4_;
  auVar81._16_4_ = auVar72._16_4_ * 0.0;
  auVar81._20_4_ = auVar72._20_4_ * 0.0;
  auVar81._24_4_ = auVar72._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar72 = vpminsd_avx2(auVar74,auVar85);
  auVar70 = vpminsd_avx2(auVar75,auVar82);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx2(auVar76,auVar81);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar73._4_4_ = uVar108;
  auVar73._0_4_ = uVar108;
  auVar73._8_4_ = uVar108;
  auVar73._12_4_ = uVar108;
  auVar73._16_4_ = uVar108;
  auVar73._20_4_ = uVar108;
  auVar73._24_4_ = uVar108;
  auVar73._28_4_ = uVar108;
  auVar70 = vmaxps_avx512vl(auVar70,auVar73);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar72,auVar70);
  auVar72 = vpmaxsd_avx2(auVar74,auVar85);
  auVar70 = vpmaxsd_avx2(auVar75,auVar82);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx2(auVar76,auVar81);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar83._4_4_ = uVar108;
  auVar83._0_4_ = uVar108;
  auVar83._8_4_ = uVar108;
  auVar83._12_4_ = uVar108;
  auVar83._16_4_ = uVar108;
  auVar83._20_4_ = uVar108;
  auVar83._24_4_ = uVar108;
  auVar83._28_4_ = uVar108;
  auVar70 = vminps_avx512vl(auVar70,auVar83);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar84._8_4_ = 0x3f800003;
  auVar84._0_8_ = 0x3f8000033f800003;
  auVar84._12_4_ = 0x3f800003;
  auVar84._16_4_ = 0x3f800003;
  auVar84._20_4_ = 0x3f800003;
  auVar84._24_4_ = 0x3f800003;
  auVar84._28_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar84);
  uVar13 = vpcmpgtd_avx512vl(auVar71,_DAT_01fe9900);
  uVar12 = vcmpps_avx512vl(local_78,auVar72,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) != 0) {
    uVar35 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
    local_308 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar236 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar237 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar238 = ZEXT1664(auVar41);
    auVar245 = ZEXT464(0x3f800000);
    auVar41 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar244 = ZEXT1664(auVar41);
    do {
      lVar31 = 0;
      for (uVar29 = uVar35; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar34 = *(uint *)(prim + 2);
      uVar6 = *(uint *)(prim + lVar31 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[uVar34].ptr;
      uVar29 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar6);
      p_Var9 = pGVar8[1].intersectionFilterN;
      pvVar10 = pGVar8[2].userPtr;
      _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar41 = *(undefined1 (*) [16])(_Var11 + uVar29 * (long)pvVar10);
      auVar51 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 1) * (long)pvVar10);
      auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar29 + 2) * (long)pvVar10);
      auVar50 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar29 + 3));
      lVar31 = *(long *)&pGVar8[1].time_range.upper;
      auVar49 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * uVar29);
      auVar48 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 1));
      auVar52 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 2));
      uVar35 = uVar35 - 1 & uVar35;
      auVar47 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar29 + 3));
      if (uVar35 != 0) {
        uVar36 = uVar35 - 1 & uVar35;
        for (uVar29 = uVar35; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        }
        if (uVar36 != 0) {
          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar118 = *(float *)(ray + k * 4 + 0x30);
      auVar110 = ZEXT816(0) << 0x40;
      auVar45._0_4_ = auVar47._0_4_ * 0.0;
      auVar45._4_4_ = auVar47._4_4_ * 0.0;
      auVar45._8_4_ = auVar47._8_4_ * 0.0;
      auVar45._12_4_ = auVar47._12_4_ * 0.0;
      auVar225._8_4_ = 0x3e2aaaab;
      auVar225._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar225._12_4_ = 0x3e2aaaab;
      auVar43 = vfmadd213ps_fma(auVar225,auVar52,auVar45);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar42);
      auVar109 = vfmadd231ps_fma(auVar43,auVar49,auVar225);
      auVar53 = auVar236._0_16_;
      auVar43 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar53);
      auVar43 = vfnmadd231ps_fma(auVar43,auVar48,auVar110);
      auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar49,auVar53);
      auVar203._0_4_ = auVar50._0_4_ * 0.0;
      auVar203._4_4_ = auVar50._4_4_ * 0.0;
      auVar203._8_4_ = auVar50._8_4_ * 0.0;
      auVar203._12_4_ = auVar50._12_4_ * 0.0;
      auVar43 = vfmadd213ps_fma(auVar225,auVar3,auVar203);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar42);
      auVar43 = vfmadd231ps_fma(auVar43,auVar41,auVar225);
      auVar45 = vfmadd231ps_avx512vl(auVar203,auVar3,auVar53);
      auVar45 = vfnmadd231ps_fma(auVar45,auVar51,auVar110);
      auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar41,auVar53);
      auVar62._0_4_ = auVar47._0_4_ * 0.16666667;
      auVar62._4_4_ = auVar47._4_4_ * 0.16666667;
      auVar62._8_4_ = auVar47._8_4_ * 0.16666667;
      auVar62._12_4_ = auVar47._12_4_ * 0.16666667;
      auVar45 = vfmadd231ps_avx512vl(auVar62,auVar52,auVar42);
      auVar45 = vfmadd231ps_fma(auVar45,auVar48,auVar225);
      auVar45 = vfmadd231ps_fma(auVar45,auVar49,auVar110);
      auVar47 = vmulps_avx512vl(auVar47,auVar53);
      auVar52 = vfmadd231ps_fma(auVar47,auVar110,auVar52);
      auVar48 = vfnmadd231ps_avx512vl(auVar52,auVar53,auVar48);
      auVar52 = vfnmadd231ps_fma(auVar48,auVar110,auVar49);
      auVar169._0_4_ = auVar50._0_4_ * 0.16666667;
      auVar169._4_4_ = auVar50._4_4_ * 0.16666667;
      auVar169._8_4_ = auVar50._8_4_ * 0.16666667;
      auVar169._12_4_ = auVar50._12_4_ * 0.16666667;
      auVar49 = vfmadd231ps_avx512vl(auVar169,auVar3,auVar42);
      auVar49 = vfmadd231ps_fma(auVar49,auVar51,auVar225);
      auVar49 = vfmadd231ps_fma(auVar49,auVar41,auVar110);
      auVar50 = vmulps_avx512vl(auVar50,auVar53);
      auVar3 = vfmadd231ps_fma(auVar50,auVar110,auVar3);
      auVar51 = vfnmadd231ps_avx512vl(auVar3,auVar53,auVar51);
      auVar48 = vfnmadd231ps_fma(auVar51,auVar110,auVar41);
      auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
      auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
      fVar105 = auVar44._0_4_;
      auVar55._0_4_ = fVar105 * auVar51._0_4_;
      fVar106 = auVar44._4_4_;
      auVar55._4_4_ = fVar106 * auVar51._4_4_;
      fVar107 = auVar44._8_4_;
      auVar55._8_4_ = fVar107 * auVar51._8_4_;
      fVar117 = auVar44._12_4_;
      auVar55._12_4_ = fVar117 * auVar51._12_4_;
      auVar51 = vfmsub231ps_fma(auVar55,auVar41,auVar43);
      auVar3 = vshufps_avx(auVar51,auVar51,0xc9);
      auVar51 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar56._0_4_ = fVar105 * auVar51._0_4_;
      auVar56._4_4_ = fVar106 * auVar51._4_4_;
      auVar56._8_4_ = fVar107 * auVar51._8_4_;
      auVar56._12_4_ = fVar117 * auVar51._12_4_;
      auVar41 = vfmsub231ps_fma(auVar56,auVar41,auVar46);
      auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
      auVar41 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar51 = vshufps_avx(auVar49,auVar49,0xc9);
      fVar124 = auVar52._0_4_;
      auVar60._0_4_ = fVar124 * auVar51._0_4_;
      fVar131 = auVar52._4_4_;
      auVar60._4_4_ = fVar131 * auVar51._4_4_;
      fVar132 = auVar52._8_4_;
      auVar60._8_4_ = fVar132 * auVar51._8_4_;
      fVar133 = auVar52._12_4_;
      auVar60._12_4_ = fVar133 * auVar51._12_4_;
      auVar51 = vfmsub231ps_fma(auVar60,auVar41,auVar49);
      auVar49 = vshufps_avx(auVar51,auVar51,0xc9);
      auVar51 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar170._0_4_ = auVar51._0_4_ * fVar124;
      auVar170._4_4_ = auVar51._4_4_ * fVar131;
      auVar170._8_4_ = auVar51._8_4_ * fVar132;
      auVar170._12_4_ = auVar51._12_4_ * fVar133;
      auVar51 = vfmsub231ps_fma(auVar170,auVar41,auVar48);
      auVar41 = vdpps_avx(auVar3,auVar3,0x7f);
      auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
      fVar191 = auVar41._0_4_;
      auVar171._4_12_ = ZEXT812(0) << 0x20;
      auVar171._0_4_ = fVar191;
      auVar51 = vrsqrt14ss_avx512f(auVar110,auVar171);
      auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
      auVar43 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
      fVar100 = auVar51._0_4_;
      auVar51 = vdpps_avx(auVar3,auVar50,0x7f);
      fVar100 = auVar47._0_4_ + auVar43._0_4_ * fVar100 * fVar100 * fVar100;
      fVar202 = fVar100 * auVar3._0_4_;
      fVar212 = fVar100 * auVar3._4_4_;
      fVar213 = fVar100 * auVar3._8_4_;
      fVar214 = fVar100 * auVar3._12_4_;
      auVar182._0_4_ = auVar50._0_4_ * fVar191;
      auVar182._4_4_ = auVar50._4_4_ * fVar191;
      auVar182._8_4_ = auVar50._8_4_ * fVar191;
      auVar182._12_4_ = auVar50._12_4_ * fVar191;
      fVar191 = auVar51._0_4_;
      auVar152._0_4_ = fVar191 * auVar3._0_4_;
      auVar152._4_4_ = fVar191 * auVar3._4_4_;
      auVar152._8_4_ = fVar191 * auVar3._8_4_;
      auVar152._12_4_ = fVar191 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar182,auVar152);
      auVar51 = vrcp14ss_avx512f(auVar110,auVar171);
      auVar41 = vfnmadd213ss_avx512f(auVar41,auVar51,ZEXT416(0x40000000));
      fVar200 = auVar51._0_4_ * auVar41._0_4_;
      auVar41 = vdpps_avx(auVar49,auVar49,0x7f);
      fVar201 = auVar41._0_4_;
      auVar172._4_12_ = ZEXT812(0) << 0x20;
      auVar172._0_4_ = fVar201;
      auVar51 = vrsqrt14ss_avx512f(auVar110,auVar172);
      auVar50 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
      auVar47 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
      fVar191 = auVar51._0_4_;
      fVar191 = auVar50._0_4_ + auVar47._0_4_ * fVar191 * fVar191 * fVar191;
      auVar51 = vdpps_avx(auVar49,auVar48,0x7f);
      fVar215 = fVar191 * auVar49._0_4_;
      fVar222 = fVar191 * auVar49._4_4_;
      fVar223 = fVar191 * auVar49._8_4_;
      fVar224 = fVar191 * auVar49._12_4_;
      auVar63._0_4_ = fVar201 * auVar48._0_4_;
      auVar63._4_4_ = fVar201 * auVar48._4_4_;
      auVar63._8_4_ = fVar201 * auVar48._8_4_;
      auVar63._12_4_ = fVar201 * auVar48._12_4_;
      fVar201 = auVar51._0_4_;
      auVar134._0_4_ = fVar201 * auVar49._0_4_;
      auVar134._4_4_ = fVar201 * auVar49._4_4_;
      auVar134._8_4_ = fVar201 * auVar49._8_4_;
      auVar134._12_4_ = fVar201 * auVar49._12_4_;
      auVar50 = vsubps_avx(auVar63,auVar134);
      auVar51 = vrcp14ss_avx512f(auVar110,auVar172);
      auVar41 = vfnmadd213ss_avx512f(auVar41,auVar51,ZEXT416(0x40000000));
      fVar201 = auVar41._0_4_ * auVar51._0_4_;
      auVar41 = vshufps_avx(auVar109,auVar109,0xff);
      auVar159._0_4_ = fVar202 * auVar41._0_4_;
      auVar159._4_4_ = fVar212 * auVar41._4_4_;
      auVar159._8_4_ = fVar213 * auVar41._8_4_;
      auVar159._12_4_ = fVar214 * auVar41._12_4_;
      local_228 = vsubps_avx(auVar109,auVar159);
      auVar51 = vshufps_avx(auVar44,auVar44,0xff);
      auVar65._0_4_ = auVar51._0_4_ * fVar202 + auVar41._0_4_ * fVar100 * fVar200 * auVar3._0_4_;
      auVar65._4_4_ = auVar51._4_4_ * fVar212 + auVar41._4_4_ * fVar100 * fVar200 * auVar3._4_4_;
      auVar65._8_4_ = auVar51._8_4_ * fVar213 + auVar41._8_4_ * fVar100 * fVar200 * auVar3._8_4_;
      auVar65._12_4_ = auVar51._12_4_ * fVar214 + auVar41._12_4_ * fVar100 * fVar200 * auVar3._12_4_
      ;
      auVar3 = vsubps_avx(auVar44,auVar65);
      local_238._0_4_ = auVar159._0_4_ + auVar109._0_4_;
      local_238._4_4_ = auVar159._4_4_ + auVar109._4_4_;
      fStack_230 = auVar159._8_4_ + auVar109._8_4_;
      fStack_22c = auVar159._12_4_ + auVar109._12_4_;
      auVar41 = vshufps_avx(auVar45,auVar45,0xff);
      auVar66._0_4_ = fVar215 * auVar41._0_4_;
      auVar66._4_4_ = fVar222 * auVar41._4_4_;
      auVar66._8_4_ = fVar223 * auVar41._8_4_;
      auVar66._12_4_ = fVar224 * auVar41._12_4_;
      local_248 = vsubps_avx512vl(auVar45,auVar66);
      auVar51 = vshufps_avx(auVar52,auVar52,0xff);
      auVar53._0_4_ = auVar51._0_4_ * fVar215 + auVar41._0_4_ * fVar191 * auVar50._0_4_ * fVar201;
      auVar53._4_4_ = auVar51._4_4_ * fVar222 + auVar41._4_4_ * fVar191 * auVar50._4_4_ * fVar201;
      auVar53._8_4_ = auVar51._8_4_ * fVar223 + auVar41._8_4_ * fVar191 * auVar50._8_4_ * fVar201;
      auVar53._12_4_ =
           auVar51._12_4_ * fVar224 + auVar41._12_4_ * fVar191 * auVar50._12_4_ * fVar201;
      auVar41 = vsubps_avx(auVar52,auVar53);
      local_258._0_4_ = auVar45._0_4_ + auVar66._0_4_;
      local_258._4_4_ = auVar45._4_4_ + auVar66._4_4_;
      fStack_250 = auVar45._8_4_ + auVar66._8_4_;
      fStack_24c = auVar45._12_4_ + auVar66._12_4_;
      auVar57._0_4_ = auVar3._0_4_ * 0.33333334;
      auVar57._4_4_ = auVar3._4_4_ * 0.33333334;
      auVar57._8_4_ = auVar3._8_4_ * 0.33333334;
      auVar57._12_4_ = auVar3._12_4_ * 0.33333334;
      local_268 = vaddps_avx512vl(local_228,auVar57);
      auVar58._0_4_ = auVar41._0_4_ * 0.33333334;
      auVar58._4_4_ = auVar41._4_4_ * 0.33333334;
      auVar58._8_4_ = auVar41._8_4_ * 0.33333334;
      auVar58._12_4_ = auVar41._12_4_ * 0.33333334;
      local_278 = vsubps_avx512vl(local_248,auVar58);
      auVar109._0_4_ = (fVar105 + auVar65._0_4_) * 0.33333334;
      auVar109._4_4_ = (fVar106 + auVar65._4_4_) * 0.33333334;
      auVar109._8_4_ = (fVar107 + auVar65._8_4_) * 0.33333334;
      auVar109._12_4_ = (fVar117 + auVar65._12_4_) * 0.33333334;
      _local_288 = vaddps_avx512vl(_local_238,auVar109);
      auVar42._0_4_ = (fVar124 + auVar53._0_4_) * 0.33333334;
      auVar42._4_4_ = (fVar131 + auVar53._4_4_) * 0.33333334;
      auVar42._8_4_ = (fVar132 + auVar53._8_4_) * 0.33333334;
      auVar42._12_4_ = (fVar133 + auVar53._12_4_) * 0.33333334;
      _local_298 = vsubps_avx512vl(_local_258,auVar42);
      local_1a8 = vsubps_avx(local_228,auVar4);
      uVar108 = local_1a8._0_4_;
      auVar54._4_4_ = uVar108;
      auVar54._0_4_ = uVar108;
      auVar54._8_4_ = uVar108;
      auVar54._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1a8,local_1a8,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar51 = vshufps_avx(local_1a8,local_1a8,0xaa);
      fVar100 = pre->ray_space[k].vz.field_0.m128[0];
      fVar191 = pre->ray_space[k].vz.field_0.m128[1];
      fVar200 = pre->ray_space[k].vz.field_0.m128[2];
      fVar201 = pre->ray_space[k].vz.field_0.m128[3];
      auVar46._0_4_ = fVar100 * auVar51._0_4_;
      auVar46._4_4_ = fVar191 * auVar51._4_4_;
      auVar46._8_4_ = fVar200 * auVar51._8_4_;
      auVar46._12_4_ = fVar201 * auVar51._12_4_;
      auVar41 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar41);
      auVar49 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar54);
      local_1b8 = vsubps_avx512vl(local_268,auVar4);
      uVar108 = local_1b8._0_4_;
      auVar61._4_4_ = uVar108;
      auVar61._0_4_ = uVar108;
      auVar61._8_4_ = uVar108;
      auVar61._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar51 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar64._0_4_ = fVar100 * auVar51._0_4_;
      auVar64._4_4_ = fVar191 * auVar51._4_4_;
      auVar64._8_4_ = fVar200 * auVar51._8_4_;
      auVar64._12_4_ = fVar201 * auVar51._12_4_;
      auVar41 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar41);
      auVar48 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar61);
      local_1c8 = vsubps_avx512vl(local_278,auVar4);
      uVar108 = local_1c8._0_4_;
      auVar144._4_4_ = uVar108;
      auVar144._0_4_ = uVar108;
      auVar144._8_4_ = uVar108;
      auVar144._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar51 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar59._0_4_ = fVar100 * auVar51._0_4_;
      auVar59._4_4_ = fVar191 * auVar51._4_4_;
      auVar59._8_4_ = fVar200 * auVar51._8_4_;
      auVar59._12_4_ = fVar201 * auVar51._12_4_;
      auVar41 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar2,auVar41);
      auVar52 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar144);
      local_1d8 = vsubps_avx512vl(local_248,auVar4);
      uVar108 = local_1d8._0_4_;
      auVar160._4_4_ = uVar108;
      auVar160._0_4_ = uVar108;
      auVar160._8_4_ = uVar108;
      auVar160._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar51 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar145._0_4_ = fVar100 * auVar51._0_4_;
      auVar145._4_4_ = fVar191 * auVar51._4_4_;
      auVar145._8_4_ = fVar200 * auVar51._8_4_;
      auVar145._12_4_ = fVar201 * auVar51._12_4_;
      auVar41 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar41);
      auVar47 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar160);
      local_1e8 = vsubps_avx(_local_238,auVar4);
      uVar108 = local_1e8._0_4_;
      auVar161._4_4_ = uVar108;
      auVar161._0_4_ = uVar108;
      auVar161._8_4_ = uVar108;
      auVar161._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar51 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar183._0_4_ = auVar51._0_4_ * fVar100;
      auVar183._4_4_ = auVar51._4_4_ * fVar191;
      auVar183._8_4_ = auVar51._8_4_ * fVar200;
      auVar183._12_4_ = auVar51._12_4_ * fVar201;
      auVar41 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar2,auVar41);
      auVar109 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar161);
      local_1f8 = vsubps_avx512vl(_local_288,auVar4);
      uVar108 = local_1f8._0_4_;
      auVar162._4_4_ = uVar108;
      auVar162._0_4_ = uVar108;
      auVar162._8_4_ = uVar108;
      auVar162._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar51 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar192._0_4_ = auVar51._0_4_ * fVar100;
      auVar192._4_4_ = auVar51._4_4_ * fVar191;
      auVar192._8_4_ = auVar51._8_4_ * fVar200;
      auVar192._12_4_ = auVar51._12_4_ * fVar201;
      auVar41 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar2,auVar41);
      auVar45 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar162);
      local_208 = vsubps_avx512vl(_local_298,auVar4);
      uVar108 = local_208._0_4_;
      auVar163._4_4_ = uVar108;
      auVar163._0_4_ = uVar108;
      auVar163._8_4_ = uVar108;
      auVar163._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_208,local_208,0x55);
      auVar51 = vshufps_avx(local_208,local_208,0xaa);
      auVar204._0_4_ = auVar51._0_4_ * fVar100;
      auVar204._4_4_ = auVar51._4_4_ * fVar191;
      auVar204._8_4_ = auVar51._8_4_ * fVar200;
      auVar204._12_4_ = auVar51._12_4_ * fVar201;
      auVar41 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar41);
      auVar42 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar163);
      local_218 = vsubps_avx(_local_258,auVar4);
      uVar108 = local_218._0_4_;
      auVar44._4_4_ = uVar108;
      auVar44._0_4_ = uVar108;
      auVar44._8_4_ = uVar108;
      auVar44._12_4_ = uVar108;
      auVar41 = vshufps_avx(local_218,local_218,0x55);
      auVar51 = vshufps_avx(local_218,local_218,0xaa);
      auVar153._0_4_ = auVar51._0_4_ * fVar100;
      auVar153._4_4_ = auVar51._4_4_ * fVar191;
      auVar153._8_4_ = auVar51._8_4_ * fVar200;
      auVar153._12_4_ = auVar51._12_4_ * fVar201;
      auVar41 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar2,auVar41);
      auVar4 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar1,auVar44);
      auVar3 = vmovlhps_avx(auVar49,auVar109);
      local_328 = vmovlhps_avx(auVar48,auVar45);
      local_338 = vmovlhps_avx512f(auVar52,auVar42);
      _local_178 = vmovlhps_avx512f(auVar47,auVar4);
      auVar51 = vminps_avx(auVar3,local_328);
      auVar41 = vmaxps_avx(auVar3,local_328);
      auVar50 = vminps_avx512vl(local_338,_local_178);
      auVar51 = vminps_avx(auVar51,auVar50);
      auVar50 = vmaxps_avx512vl(local_338,_local_178);
      auVar41 = vmaxps_avx(auVar41,auVar50);
      auVar50 = vshufpd_avx(auVar51,auVar51,3);
      auVar51 = vminps_avx(auVar51,auVar50);
      auVar50 = vshufpd_avx(auVar41,auVar41,3);
      auVar41 = vmaxps_avx(auVar41,auVar50);
      auVar51 = vandps_avx512vl(auVar51,auVar237._0_16_);
      auVar41 = vandps_avx512vl(auVar41,auVar237._0_16_);
      auVar41 = vmaxps_avx(auVar51,auVar41);
      auVar51 = vmovshdup_avx(auVar41);
      auVar41 = vmaxss_avx(auVar51,auVar41);
      auVar50 = vmovddup_avx512vl(auVar49);
      auVar49 = vmovddup_avx512vl(auVar48);
      auVar48 = vmovddup_avx512vl(auVar52);
      auVar110._8_8_ = auVar47._0_8_;
      auVar110._0_8_ = auVar47._0_8_;
      local_188 = ZEXT416((uint)(auVar41._0_4_ * 9.536743e-07));
      local_148 = vbroadcastss_avx512vl(local_188);
      auVar41 = vxorps_avx512vl(local_148._0_16_,auVar238._0_16_);
      local_168 = vbroadcastss_avx512vl(auVar41);
      uVar29 = 0;
      auVar41 = vsubps_avx(local_328,auVar3);
      auVar52 = vsubps_avx512vl(local_338,local_328);
      local_198 = vsubps_avx512vl(_local_178,local_338);
      local_2a8 = vsubps_avx(_local_238,local_228);
      local_2b8 = vsubps_avx512vl(_local_288,local_268);
      local_2c8 = vsubps_avx512vl(_local_298,local_278);
      _local_2d8 = vsubps_avx512vl(_local_258,local_248);
      local_2e8 = vpbroadcastd_avx512vl();
      local_2f8 = vpbroadcastd_avx512vl();
      auVar51 = ZEXT816(0x3f80000000000000);
      auVar43 = auVar51;
LAB_01cc8ad5:
      auVar47 = vshufps_avx(auVar43,auVar43,0x50);
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = 0x3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._0_16_ = auVar226;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar44 = vsubps_avx(auVar226,auVar47);
      fVar100 = auVar47._0_4_;
      fVar105 = auVar109._0_4_;
      auVar125._0_4_ = fVar105 * fVar100;
      fVar191 = auVar47._4_4_;
      fVar106 = auVar109._4_4_;
      auVar125._4_4_ = fVar106 * fVar191;
      fVar200 = auVar47._8_4_;
      auVar125._8_4_ = fVar105 * fVar200;
      fVar201 = auVar47._12_4_;
      auVar125._12_4_ = fVar106 * fVar201;
      fVar107 = auVar45._0_4_;
      auVar135._0_4_ = fVar107 * fVar100;
      fVar117 = auVar45._4_4_;
      auVar135._4_4_ = fVar117 * fVar191;
      auVar135._8_4_ = fVar107 * fVar200;
      auVar135._12_4_ = fVar117 * fVar201;
      fVar124 = auVar42._0_4_;
      auVar146._0_4_ = fVar124 * fVar100;
      fVar131 = auVar42._4_4_;
      auVar146._4_4_ = fVar131 * fVar191;
      auVar146._8_4_ = fVar124 * fVar200;
      auVar146._12_4_ = fVar131 * fVar201;
      fVar132 = auVar4._0_4_;
      auVar112._0_4_ = fVar132 * fVar100;
      fVar133 = auVar4._4_4_;
      auVar112._4_4_ = fVar133 * fVar191;
      auVar112._8_4_ = fVar132 * fVar200;
      auVar112._12_4_ = fVar133 * fVar201;
      auVar46 = vfmadd231ps_avx512vl(auVar125,auVar44,auVar50);
      auVar53 = vfmadd231ps_avx512vl(auVar135,auVar44,auVar49);
      auVar54 = vfmadd231ps_avx512vl(auVar146,auVar44,auVar48);
      auVar44 = vfmadd231ps_fma(auVar112,auVar110,auVar44);
      auVar47 = vmovshdup_avx(auVar51);
      fVar191 = auVar51._0_4_;
      fVar100 = (auVar47._0_4_ - fVar191) * 0.04761905;
      auVar168._4_4_ = fVar191;
      auVar168._0_4_ = fVar191;
      auVar168._8_4_ = fVar191;
      auVar168._12_4_ = fVar191;
      auVar168._16_4_ = fVar191;
      auVar168._20_4_ = fVar191;
      auVar168._24_4_ = fVar191;
      auVar168._28_4_ = fVar191;
      auVar122._0_8_ = auVar47._0_8_;
      auVar122._8_8_ = auVar122._0_8_;
      auVar122._16_8_ = auVar122._0_8_;
      auVar122._24_8_ = auVar122._0_8_;
      auVar72 = vsubps_avx(auVar122,auVar168);
      uVar108 = auVar46._0_4_;
      auVar123._4_4_ = uVar108;
      auVar123._0_4_ = uVar108;
      auVar123._8_4_ = uVar108;
      auVar123._12_4_ = uVar108;
      auVar123._16_4_ = uVar108;
      auVar123._20_4_ = uVar108;
      auVar123._24_4_ = uVar108;
      auVar123._28_4_ = uVar108;
      auVar188._8_4_ = 1;
      auVar188._0_8_ = 0x100000001;
      auVar188._12_4_ = 1;
      auVar188._16_4_ = 1;
      auVar188._20_4_ = 1;
      auVar188._24_4_ = 1;
      auVar188._28_4_ = 1;
      auVar83 = ZEXT1632(auVar46);
      auVar70 = vpermps_avx2(auVar188,auVar83);
      auVar73 = vbroadcastss_avx512vl(auVar53);
      auVar84 = ZEXT1632(auVar53);
      auVar71 = vpermps_avx512vl(auVar188,auVar84);
      auVar74 = vbroadcastss_avx512vl(auVar54);
      auVar68 = ZEXT1632(auVar54);
      auVar75 = vpermps_avx512vl(auVar188,auVar68);
      auVar76 = vbroadcastss_avx512vl(auVar44);
      auVar80 = ZEXT1632(auVar44);
      auVar77 = vpermps_avx512vl(auVar188,auVar80);
      auVar189._4_4_ = fVar100;
      auVar189._0_4_ = fVar100;
      auVar189._8_4_ = fVar100;
      auVar189._12_4_ = fVar100;
      auVar189._16_4_ = fVar100;
      auVar189._20_4_ = fVar100;
      auVar189._24_4_ = fVar100;
      auVar189._28_4_ = fVar100;
      auVar81 = auVar243._0_32_;
      auVar69 = vpermps_avx512vl(auVar81,auVar83);
      auVar158._8_4_ = 3;
      auVar158._0_8_ = 0x300000003;
      auVar158._12_4_ = 3;
      auVar158._16_4_ = 3;
      auVar158._20_4_ = 3;
      auVar158._24_4_ = 3;
      auVar158._28_4_ = 3;
      auVar78 = vpermps_avx512vl(auVar158,auVar83);
      auVar79 = vpermps_avx512vl(auVar81,auVar84);
      auVar83 = vpermps_avx2(auVar158,auVar84);
      auVar67 = vpermps_avx512vl(auVar81,auVar68);
      auVar84 = vpermps_avx2(auVar158,auVar68);
      auVar68 = vpermps_avx512vl(auVar81,auVar80);
      auVar80 = vpermps_avx512vl(auVar158,auVar80);
      auVar47 = vfmadd132ps_fma(auVar72,auVar168,_DAT_01faff20);
      auVar72 = vsubps_avx(auVar229,ZEXT1632(auVar47));
      auVar81 = vmulps_avx512vl(auVar73,ZEXT1632(auVar47));
      auVar85 = ZEXT1632(auVar47);
      auVar82 = vmulps_avx512vl(auVar71,auVar85);
      auVar44 = vfmadd231ps_fma(auVar81,auVar72,auVar123);
      auVar46 = vfmadd231ps_fma(auVar82,auVar72,auVar70);
      auVar81 = vmulps_avx512vl(auVar74,auVar85);
      auVar82 = vmulps_avx512vl(auVar75,auVar85);
      auVar73 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar73);
      auVar71 = vfmadd231ps_avx512vl(auVar82,auVar72,auVar71);
      auVar81 = vmulps_avx512vl(auVar76,auVar85);
      auVar82 = ZEXT1632(auVar47);
      auVar77 = vmulps_avx512vl(auVar77,auVar82);
      auVar74 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar74);
      auVar75 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar75);
      fVar200 = auVar47._0_4_;
      fVar201 = auVar47._4_4_;
      auVar18._4_4_ = fVar201 * auVar73._4_4_;
      auVar18._0_4_ = fVar200 * auVar73._0_4_;
      fVar202 = auVar47._8_4_;
      auVar18._8_4_ = fVar202 * auVar73._8_4_;
      fVar212 = auVar47._12_4_;
      auVar18._12_4_ = fVar212 * auVar73._12_4_;
      auVar18._16_4_ = auVar73._16_4_ * 0.0;
      auVar18._20_4_ = auVar73._20_4_ * 0.0;
      auVar18._24_4_ = auVar73._24_4_ * 0.0;
      auVar18._28_4_ = fVar191;
      auVar19._4_4_ = fVar201 * auVar71._4_4_;
      auVar19._0_4_ = fVar200 * auVar71._0_4_;
      auVar19._8_4_ = fVar202 * auVar71._8_4_;
      auVar19._12_4_ = fVar212 * auVar71._12_4_;
      auVar19._16_4_ = auVar71._16_4_ * 0.0;
      auVar19._20_4_ = auVar71._20_4_ * 0.0;
      auVar19._24_4_ = auVar71._24_4_ * 0.0;
      auVar19._28_4_ = auVar70._28_4_;
      auVar44 = vfmadd231ps_fma(auVar18,auVar72,ZEXT1632(auVar44));
      auVar46 = vfmadd231ps_fma(auVar19,auVar72,ZEXT1632(auVar46));
      auVar115._0_4_ = fVar200 * auVar74._0_4_;
      auVar115._4_4_ = fVar201 * auVar74._4_4_;
      auVar115._8_4_ = fVar202 * auVar74._8_4_;
      auVar115._12_4_ = fVar212 * auVar74._12_4_;
      auVar115._16_4_ = auVar74._16_4_ * 0.0;
      auVar115._20_4_ = auVar74._20_4_ * 0.0;
      auVar115._24_4_ = auVar74._24_4_ * 0.0;
      auVar115._28_4_ = 0;
      auVar20._4_4_ = fVar201 * auVar75._4_4_;
      auVar20._0_4_ = fVar200 * auVar75._0_4_;
      auVar20._8_4_ = fVar202 * auVar75._8_4_;
      auVar20._12_4_ = fVar212 * auVar75._12_4_;
      auVar20._16_4_ = auVar75._16_4_ * 0.0;
      auVar20._20_4_ = auVar75._20_4_ * 0.0;
      auVar20._24_4_ = auVar75._24_4_ * 0.0;
      auVar20._28_4_ = auVar74._28_4_;
      auVar53 = vfmadd231ps_fma(auVar115,auVar72,auVar73);
      auVar54 = vfmadd231ps_fma(auVar20,auVar72,auVar71);
      auVar21._28_4_ = auVar71._28_4_;
      auVar21._0_28_ =
           ZEXT1628(CONCAT412(fVar212 * auVar54._12_4_,
                              CONCAT48(fVar202 * auVar54._8_4_,
                                       CONCAT44(fVar201 * auVar54._4_4_,fVar200 * auVar54._0_4_))));
      auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar212 * auVar53._12_4_,
                                                   CONCAT48(fVar202 * auVar53._8_4_,
                                                            CONCAT44(fVar201 * auVar53._4_4_,
                                                                     fVar200 * auVar53._0_4_)))),
                                auVar72,ZEXT1632(auVar44));
      auVar62 = vfmadd231ps_fma(auVar21,auVar72,ZEXT1632(auVar46));
      auVar70 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar44));
      auVar73 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar46));
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar70 = vmulps_avx512vl(auVar70,auVar71);
      auVar73 = vmulps_avx512vl(auVar73,auVar71);
      auVar181._0_4_ = fVar100 * auVar70._0_4_;
      auVar181._4_4_ = fVar100 * auVar70._4_4_;
      auVar181._8_4_ = fVar100 * auVar70._8_4_;
      auVar181._12_4_ = fVar100 * auVar70._12_4_;
      auVar181._16_4_ = fVar100 * auVar70._16_4_;
      auVar181._20_4_ = fVar100 * auVar70._20_4_;
      auVar181._24_4_ = fVar100 * auVar70._24_4_;
      auVar181._28_4_ = 0;
      auVar70 = vmulps_avx512vl(auVar189,auVar73);
      auVar46 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
      auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01feed00,ZEXT1632(auVar46));
      auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01feed00,ZEXT1632(auVar46));
      auVar116._0_4_ = auVar181._0_4_ + auVar64._0_4_;
      auVar116._4_4_ = auVar181._4_4_ + auVar64._4_4_;
      auVar116._8_4_ = auVar181._8_4_ + auVar64._8_4_;
      auVar116._12_4_ = auVar181._12_4_ + auVar64._12_4_;
      auVar116._16_4_ = auVar181._16_4_ + 0.0;
      auVar116._20_4_ = auVar181._20_4_ + 0.0;
      auVar116._24_4_ = auVar181._24_4_ + 0.0;
      auVar116._28_4_ = 0;
      auVar85 = ZEXT1632(auVar46);
      auVar75 = vpermt2ps_avx512vl(auVar181,_DAT_01feed00,auVar85);
      auVar76 = vaddps_avx512vl(ZEXT1632(auVar62),auVar70);
      auVar77 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar85);
      auVar70 = vsubps_avx(auVar73,auVar75);
      auVar75 = vsubps_avx512vl(auVar74,auVar77);
      auVar77 = vmulps_avx512vl(auVar79,auVar82);
      auVar81 = vmulps_avx512vl(auVar83,auVar82);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar69);
      auVar69 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar78);
      auVar78 = vmulps_avx512vl(auVar67,auVar82);
      auVar81 = vmulps_avx512vl(auVar84,auVar82);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,auVar79);
      auVar83 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar83);
      auVar79 = vmulps_avx512vl(auVar68,auVar82);
      auVar68 = vmulps_avx512vl(auVar80,auVar82);
      auVar44 = vfmadd231ps_fma(auVar79,auVar72,auVar67);
      auVar79 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar84);
      auVar67 = vmulps_avx512vl(auVar82,auVar78);
      auVar80 = ZEXT1632(auVar47);
      auVar68 = vmulps_avx512vl(auVar80,auVar83);
      auVar77 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar77);
      auVar69 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar69);
      auVar79 = vmulps_avx512vl(auVar80,auVar79);
      auVar78 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar212 * auVar44._12_4_,
                                              CONCAT48(fVar202 * auVar44._8_4_,
                                                       CONCAT44(fVar201 * auVar44._4_4_,
                                                                fVar200 * auVar44._0_4_)))),auVar72,
                           auVar78);
      auVar83 = vfmadd231ps_avx512vl(auVar79,auVar72,auVar83);
      auVar22._4_4_ = fVar201 * auVar78._4_4_;
      auVar22._0_4_ = fVar200 * auVar78._0_4_;
      auVar22._8_4_ = fVar202 * auVar78._8_4_;
      auVar22._12_4_ = fVar212 * auVar78._12_4_;
      auVar22._16_4_ = auVar78._16_4_ * 0.0;
      auVar22._20_4_ = auVar78._20_4_ * 0.0;
      auVar22._24_4_ = auVar78._24_4_ * 0.0;
      auVar22._28_4_ = auVar84._28_4_;
      auVar84 = vmulps_avx512vl(auVar80,auVar83);
      auVar79 = vfmadd231ps_avx512vl(auVar22,auVar72,auVar77);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar69,auVar72);
      auVar72 = vsubps_avx512vl(auVar78,auVar77);
      auVar83 = vsubps_avx512vl(auVar83,auVar69);
      auVar72 = vmulps_avx512vl(auVar72,auVar71);
      auVar83 = vmulps_avx512vl(auVar83,auVar71);
      fVar191 = fVar100 * auVar72._0_4_;
      fVar200 = fVar100 * auVar72._4_4_;
      auVar23._4_4_ = fVar200;
      auVar23._0_4_ = fVar191;
      fVar201 = fVar100 * auVar72._8_4_;
      auVar23._8_4_ = fVar201;
      fVar202 = fVar100 * auVar72._12_4_;
      auVar23._12_4_ = fVar202;
      fVar212 = fVar100 * auVar72._16_4_;
      auVar23._16_4_ = fVar212;
      fVar213 = fVar100 * auVar72._20_4_;
      auVar23._20_4_ = fVar213;
      fVar100 = fVar100 * auVar72._24_4_;
      auVar23._24_4_ = fVar100;
      auVar23._28_4_ = auVar72._28_4_;
      auVar83 = vmulps_avx512vl(auVar189,auVar83);
      auVar71 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar85);
      auVar77 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar85);
      auVar190._0_4_ = auVar79._0_4_ + fVar191;
      auVar190._4_4_ = auVar79._4_4_ + fVar200;
      auVar190._8_4_ = auVar79._8_4_ + fVar201;
      auVar190._12_4_ = auVar79._12_4_ + fVar202;
      auVar190._16_4_ = auVar79._16_4_ + fVar212;
      auVar190._20_4_ = auVar79._20_4_ + fVar213;
      auVar190._24_4_ = auVar79._24_4_ + fVar100;
      auVar190._28_4_ = auVar79._28_4_ + auVar72._28_4_;
      auVar72 = vpermt2ps_avx512vl(auVar23,_DAT_01feed00,ZEXT1632(auVar46));
      auVar69 = vaddps_avx512vl(auVar84,auVar83);
      auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,ZEXT1632(auVar46));
      auVar72 = vsubps_avx(auVar71,auVar72);
      auVar83 = vsubps_avx512vl(auVar77,auVar83);
      auVar129 = ZEXT1632(auVar64);
      auVar78 = vsubps_avx512vl(auVar79,auVar129);
      auVar141 = ZEXT1632(auVar62);
      auVar67 = vsubps_avx512vl(auVar84,auVar141);
      auVar68 = vsubps_avx512vl(auVar71,auVar73);
      auVar78 = vaddps_avx512vl(auVar78,auVar68);
      auVar68 = vsubps_avx512vl(auVar77,auVar74);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar141,auVar78);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar129,auVar67);
      auVar80 = vmulps_avx512vl(auVar76,auVar78);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar116,auVar67);
      auVar81 = vmulps_avx512vl(auVar75,auVar78);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar70,auVar67);
      auVar82 = vmulps_avx512vl(auVar74,auVar78);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar73,auVar67);
      auVar85 = vmulps_avx512vl(auVar84,auVar78);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar79,auVar67);
      auVar86 = vmulps_avx512vl(auVar69,auVar78);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar190,auVar67);
      auVar87 = vmulps_avx512vl(auVar83,auVar78);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar72,auVar67);
      auVar78 = vmulps_avx512vl(auVar77,auVar78);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar71,auVar67);
      auVar67 = vminps_avx512vl(auVar68,auVar80);
      auVar68 = vmaxps_avx512vl(auVar68,auVar80);
      auVar80 = vminps_avx512vl(auVar81,auVar82);
      auVar67 = vminps_avx512vl(auVar67,auVar80);
      auVar80 = vmaxps_avx512vl(auVar81,auVar82);
      auVar68 = vmaxps_avx512vl(auVar68,auVar80);
      auVar80 = vminps_avx512vl(auVar85,auVar86);
      auVar81 = vmaxps_avx512vl(auVar85,auVar86);
      auVar82 = vminps_avx512vl(auVar87,auVar78);
      auVar80 = vminps_avx512vl(auVar80,auVar82);
      auVar67 = vminps_avx512vl(auVar67,auVar80);
      auVar78 = vmaxps_avx512vl(auVar87,auVar78);
      auVar78 = vmaxps_avx512vl(auVar81,auVar78);
      auVar78 = vmaxps_avx512vl(auVar68,auVar78);
      uVar12 = vcmpps_avx512vl(auVar67,local_148,2);
      uVar13 = vcmpps_avx512vl(auVar78,local_168,5);
      bVar27 = (byte)uVar12 & (byte)uVar13 & 0x7f;
      if (bVar27 != 0) {
        auVar78 = vsubps_avx512vl(auVar73,auVar129);
        auVar67 = vsubps_avx512vl(auVar74,auVar141);
        auVar68 = vsubps_avx512vl(auVar71,auVar79);
        auVar78 = vaddps_avx512vl(auVar78,auVar68);
        auVar68 = vsubps_avx512vl(auVar77,auVar84);
        auVar67 = vaddps_avx512vl(auVar67,auVar68);
        auVar68 = vmulps_avx512vl(auVar141,auVar78);
        auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar129);
        auVar76 = vmulps_avx512vl(auVar76,auVar78);
        auVar76 = vfnmadd213ps_avx512vl(auVar116,auVar67,auVar76);
        auVar75 = vmulps_avx512vl(auVar75,auVar78);
        auVar75 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar75);
        auVar70 = vmulps_avx512vl(auVar74,auVar78);
        auVar74 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar73);
        auVar70 = vmulps_avx512vl(auVar84,auVar78);
        auVar84 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar79);
        auVar70 = vmulps_avx512vl(auVar69,auVar78);
        auVar69 = vfnmadd213ps_avx512vl(auVar190,auVar67,auVar70);
        auVar70 = vmulps_avx512vl(auVar83,auVar78);
        auVar79 = vfnmadd213ps_avx512vl(auVar72,auVar67,auVar70);
        auVar72 = vmulps_avx512vl(auVar77,auVar78);
        auVar71 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar67);
        auVar70 = vminps_avx(auVar68,auVar76);
        auVar72 = vmaxps_avx(auVar68,auVar76);
        auVar73 = vminps_avx(auVar75,auVar74);
        auVar73 = vminps_avx(auVar70,auVar73);
        auVar70 = vmaxps_avx(auVar75,auVar74);
        auVar72 = vmaxps_avx(auVar72,auVar70);
        auVar83 = vminps_avx(auVar84,auVar69);
        auVar70 = vmaxps_avx(auVar84,auVar69);
        auVar84 = vminps_avx(auVar79,auVar71);
        auVar83 = vminps_avx(auVar83,auVar84);
        auVar83 = vminps_avx(auVar73,auVar83);
        auVar73 = vmaxps_avx(auVar79,auVar71);
        auVar70 = vmaxps_avx(auVar70,auVar73);
        auVar72 = vmaxps_avx(auVar72,auVar70);
        uVar12 = vcmpps_avx512vl(auVar72,local_168,5);
        uVar13 = vcmpps_avx512vl(auVar83,local_148,2);
        bVar27 = bVar27 & (byte)uVar12 & (byte)uVar13;
        if (bVar27 != 0) {
          auStack_318[uVar29] = (uint)bVar27;
          uVar12 = vmovlps_avx(auVar51);
          (&uStack_128)[uVar29] = uVar12;
          uVar36 = vmovlps_avx(auVar43);
          auStack_58[uVar29] = uVar36;
          uVar29 = (ulong)((int)uVar29 + 1);
        }
      }
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar236 = ZEXT1664(auVar51);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar237 = ZEXT1664(auVar51);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar238 = ZEXT1664(auVar51);
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar239 = ZEXT3264(auVar72);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar240 = ZEXT1664(auVar51);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar241 = ZEXT1664(auVar51);
      auVar242 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar29 != 0) {
        do {
          uVar28 = (int)uVar29 - 1;
          uVar30 = (ulong)uVar28;
          uVar7 = auStack_318[uVar30];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = auStack_58[uVar30];
          uVar36 = 0;
          for (uVar33 = (ulong)uVar7; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000)
          {
            uVar36 = uVar36 + 1;
          }
          uVar32 = uVar7 - 1 & uVar7;
          bVar39 = uVar32 == 0;
          auStack_318[uVar30] = uVar32;
          if (bVar39) {
            uVar29 = (ulong)uVar28;
          }
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar36;
          auVar51 = vpunpcklqdq_avx(auVar101,ZEXT416((int)uVar36 + 1));
          auVar51 = vcvtqq2ps_avx512vl(auVar51);
          auVar51 = vmulps_avx512vl(auVar51,auVar240._0_16_);
          uVar108 = *(undefined4 *)((long)&uStack_128 + uVar30 * 8 + 4);
          auVar14._4_4_ = uVar108;
          auVar14._0_4_ = uVar108;
          auVar14._8_4_ = uVar108;
          auVar14._12_4_ = uVar108;
          auVar47 = vmulps_avx512vl(auVar51,auVar14);
          auVar44 = auVar241._0_16_;
          auVar51 = vsubps_avx512vl(auVar44,auVar51);
          uVar108 = *(undefined4 *)(&uStack_128 + uVar30);
          auVar15._4_4_ = uVar108;
          auVar15._0_4_ = uVar108;
          auVar15._8_4_ = uVar108;
          auVar15._12_4_ = uVar108;
          auVar51 = vfmadd231ps_avx512vl(auVar47,auVar51,auVar15);
          auVar47 = vmovshdup_avx(auVar51);
          fVar100 = auVar47._0_4_ - auVar51._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar100));
          if (uVar7 == 0 || bVar39) goto LAB_01cc8ad5;
          auVar47 = vshufps_avx(auVar43,auVar43,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar100));
          auVar54 = vsubps_avx512vl(auVar44,auVar47);
          fVar191 = auVar47._0_4_;
          auVar136._0_4_ = fVar191 * fVar105;
          fVar200 = auVar47._4_4_;
          auVar136._4_4_ = fVar200 * fVar106;
          fVar201 = auVar47._8_4_;
          auVar136._8_4_ = fVar201 * fVar105;
          fVar202 = auVar47._12_4_;
          auVar136._12_4_ = fVar202 * fVar106;
          auVar147._0_4_ = fVar191 * fVar107;
          auVar147._4_4_ = fVar200 * fVar117;
          auVar147._8_4_ = fVar201 * fVar107;
          auVar147._12_4_ = fVar202 * fVar117;
          auVar154._0_4_ = fVar191 * fVar124;
          auVar154._4_4_ = fVar200 * fVar131;
          auVar154._8_4_ = fVar201 * fVar124;
          auVar154._12_4_ = fVar202 * fVar131;
          auVar119._0_4_ = fVar191 * fVar132;
          auVar119._4_4_ = fVar200 * fVar133;
          auVar119._8_4_ = fVar201 * fVar132;
          auVar119._12_4_ = fVar202 * fVar133;
          auVar47 = vfmadd231ps_fma(auVar136,auVar54,auVar50);
          auVar46 = vfmadd231ps_fma(auVar147,auVar54,auVar49);
          auVar53 = vfmadd231ps_fma(auVar154,auVar54,auVar48);
          auVar54 = vfmadd231ps_fma(auVar119,auVar110,auVar54);
          auVar130._16_16_ = auVar47;
          auVar130._0_16_ = auVar47;
          auVar142._16_16_ = auVar46;
          auVar142._0_16_ = auVar46;
          auVar151._16_16_ = auVar53;
          auVar151._0_16_ = auVar53;
          auVar70 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar51));
          auVar72 = vsubps_avx(auVar142,auVar130);
          auVar46 = vfmadd213ps_fma(auVar72,auVar70,auVar130);
          auVar72 = vsubps_avx(auVar151,auVar142);
          auVar64 = vfmadd213ps_fma(auVar72,auVar70,auVar142);
          auVar47 = vsubps_avx(auVar54,auVar53);
          auVar143._16_16_ = auVar47;
          auVar143._0_16_ = auVar47;
          auVar47 = vfmadd213ps_fma(auVar143,auVar70,auVar151);
          auVar72 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar46));
          auVar46 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar46));
          auVar72 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar64));
          auVar47 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar64));
          auVar72 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar46));
          auVar134 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar72,auVar70);
          auVar72 = vmulps_avx512vl(auVar72,auVar239._0_32_);
          auVar89._16_16_ = auVar72._16_16_;
          fVar191 = fVar100 * 0.33333334;
          auVar155._0_8_ =
               CONCAT44(auVar134._4_4_ + fVar191 * auVar72._4_4_,
                        auVar134._0_4_ + fVar191 * auVar72._0_4_);
          auVar155._8_4_ = auVar134._8_4_ + fVar191 * auVar72._8_4_;
          auVar155._12_4_ = auVar134._12_4_ + fVar191 * auVar72._12_4_;
          auVar137._0_4_ = fVar191 * auVar72._16_4_;
          auVar137._4_4_ = fVar191 * auVar72._20_4_;
          auVar137._8_4_ = fVar191 * auVar72._24_4_;
          auVar137._12_4_ = fVar191 * auVar72._28_4_;
          auVar61 = vsubps_avx((undefined1  [16])0x0,auVar137);
          auVar64 = vshufpd_avx(auVar134,auVar134,3);
          auVar62 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar47 = vsubps_avx(auVar64,auVar134);
          auVar46 = vsubps_avx(auVar62,(undefined1  [16])0x0);
          auVar173._0_4_ = auVar47._0_4_ + auVar46._0_4_;
          auVar173._4_4_ = auVar47._4_4_ + auVar46._4_4_;
          auVar173._8_4_ = auVar47._8_4_ + auVar46._8_4_;
          auVar173._12_4_ = auVar47._12_4_ + auVar46._12_4_;
          auVar47 = vshufps_avx(auVar134,auVar134,0xb1);
          auVar46 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar53 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar227._4_4_ = auVar173._0_4_;
          auVar227._0_4_ = auVar173._0_4_;
          auVar227._8_4_ = auVar173._0_4_;
          auVar227._12_4_ = auVar173._0_4_;
          auVar57 = vshufps_avx(auVar173,auVar173,0x55);
          fVar191 = auVar57._0_4_;
          auVar184._0_4_ = auVar47._0_4_ * fVar191;
          fVar200 = auVar57._4_4_;
          auVar184._4_4_ = auVar47._4_4_ * fVar200;
          fVar201 = auVar57._8_4_;
          auVar184._8_4_ = auVar47._8_4_ * fVar201;
          fVar202 = auVar57._12_4_;
          auVar184._12_4_ = auVar47._12_4_ * fVar202;
          auVar193._0_4_ = auVar46._0_4_ * fVar191;
          auVar193._4_4_ = auVar46._4_4_ * fVar200;
          auVar193._8_4_ = auVar46._8_4_ * fVar201;
          auVar193._12_4_ = auVar46._12_4_ * fVar202;
          auVar205._0_4_ = auVar53._0_4_ * fVar191;
          auVar205._4_4_ = auVar53._4_4_ * fVar200;
          auVar205._8_4_ = auVar53._8_4_ * fVar201;
          auVar205._12_4_ = auVar53._12_4_ * fVar202;
          auVar174._0_4_ = auVar54._0_4_ * fVar191;
          auVar174._4_4_ = auVar54._4_4_ * fVar200;
          auVar174._8_4_ = auVar54._8_4_ * fVar201;
          auVar174._12_4_ = auVar54._12_4_ * fVar202;
          auVar47 = vfmadd231ps_fma(auVar184,auVar227,auVar134);
          auVar46 = vfmadd231ps_fma(auVar193,auVar227,auVar155);
          auVar59 = vfmadd231ps_fma(auVar205,auVar227,auVar61);
          auVar60 = vfmadd231ps_fma(auVar174,(undefined1  [16])0x0,auVar227);
          auVar57 = vshufpd_avx(auVar47,auVar47,1);
          auVar58 = vshufpd_avx(auVar46,auVar46,1);
          auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
          auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar53 = vminss_avx(auVar47,auVar46);
          auVar47 = vmaxss_avx(auVar46,auVar47);
          auVar54 = vminss_avx(auVar59,auVar60);
          auVar46 = vmaxss_avx(auVar60,auVar59);
          auVar53 = vminss_avx(auVar53,auVar54);
          auVar47 = vmaxss_avx(auVar46,auVar47);
          auVar54 = vminss_avx(auVar57,auVar58);
          auVar46 = vmaxss_avx(auVar58,auVar57);
          auVar57 = vminss_avx512f(auVar55,auVar56);
          auVar58 = vmaxss_avx512f(auVar56,auVar55);
          auVar46 = vmaxss_avx(auVar58,auVar46);
          auVar54 = vminss_avx512f(auVar54,auVar57);
          fVar200 = auVar46._0_4_;
          fVar191 = auVar47._0_4_;
          if (0.0001 <= auVar53._0_4_) {
LAB_01cc9208:
            vucomiss_avx512f(auVar54);
            bVar40 = fVar200 <= -0.0001;
            bVar38 = -0.0001 < fVar191;
            bVar37 = bVar40;
            if (!bVar40) goto LAB_01cc925e;
            uVar12 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar13 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar27 = (byte)uVar12 & (byte)uVar13 & 1;
            bVar40 = bVar38 && bVar27 == 0;
            bVar37 = bVar38 && bVar27 == 0;
            if (bVar38 && bVar27 == 0) goto LAB_01cc925e;
          }
          else {
            bVar40 = fVar200 == -0.0001;
            bVar37 = NAN(fVar200);
            if (fVar200 <= -0.0001) goto LAB_01cc9208;
LAB_01cc925e:
            auVar59 = auVar244._0_16_;
            vcmpss_avx512f(auVar53,auVar59,1);
            uVar12 = vcmpss_avx512f(auVar47,auVar59,1);
            bVar38 = (bool)((byte)uVar12 & 1);
            auVar89._0_16_ = auVar245._0_16_;
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar245._0_4_);
            vucomiss_avx512f(auVar88._0_16_);
            bVar37 = (bool)(!bVar40 | bVar37);
            bVar38 = bVar37 == false;
            auVar91._16_16_ = auVar89._16_16_;
            auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar90._4_28_ = auVar91._4_28_;
            auVar90._0_4_ = (uint)bVar37 * auVar244._0_4_ + (uint)!bVar37 * 0x7f800000;
            auVar58 = auVar90._0_16_;
            auVar93._16_16_ = auVar89._16_16_;
            auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (uint)bVar37 * auVar244._0_4_ + (uint)!bVar37 * -0x800000;
            auVar57 = auVar92._0_16_;
            uVar12 = vcmpss_avx512f(auVar54,auVar59,1);
            bVar40 = (bool)((byte)uVar12 & 1);
            auVar95._16_16_ = auVar89._16_16_;
            auVar95._0_16_ = auVar245._0_16_;
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar245._0_4_);
            vucomiss_avx512f(auVar94._0_16_);
            if ((bVar37) || (bVar38)) {
              auVar54 = vucomiss_avx512f(auVar53);
              if ((bVar37) || (bVar38)) {
                auVar60 = vxorps_avx512vl(auVar53,auVar238._0_16_);
                auVar53 = vsubss_avx512f(auVar54,auVar53);
                auVar53 = vdivss_avx512f(auVar60,auVar53);
                auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
                auVar54 = vfmadd213ss_avx512f(auVar54,auVar59,auVar53);
                auVar53 = auVar54;
              }
              else {
                auVar53 = vxorps_avx512vl(auVar54,auVar54);
                vucomiss_avx512f(auVar53);
                auVar54 = ZEXT416(0x3f800000);
                if ((bVar37) || (bVar38)) {
                  auVar54 = SUB6416(ZEXT464(0xff800000),0);
                  auVar53 = ZEXT416(0x7f800000);
                }
              }
              auVar58 = vminss_avx512f(auVar58,auVar53);
              auVar57 = vmaxss_avx(auVar54,auVar57);
            }
            auVar245 = ZEXT464(0x3f800000);
            uVar12 = vcmpss_avx512f(auVar46,auVar59,1);
            bVar40 = (bool)((byte)uVar12 & 1);
            auVar46 = auVar245._0_16_;
            fVar201 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * 0x3f800000);
            if ((auVar88._0_4_ != fVar201) || (NAN(auVar88._0_4_) || NAN(fVar201))) {
              if ((fVar200 != fVar191) || (NAN(fVar200) || NAN(fVar191))) {
                auVar47 = vxorps_avx512vl(auVar47,auVar238._0_16_);
                auVar175._0_4_ = auVar47._0_4_ / (fVar200 - fVar191);
                auVar175._4_12_ = auVar47._4_12_;
                auVar47 = vsubss_avx512f(auVar46,auVar175);
                auVar47 = vfmadd213ss_avx512f(auVar47,auVar59,auVar175);
                auVar53 = auVar47;
              }
              else if ((fVar191 != 0.0) ||
                      (auVar47 = auVar46, auVar53 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar191))) {
                auVar47 = SUB6416(ZEXT464(0xff800000),0);
                auVar53 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar58 = vminss_avx(auVar58,auVar53);
              auVar57 = vmaxss_avx(auVar47,auVar57);
            }
            bVar40 = auVar94._0_4_ != fVar201;
            auVar47 = vminss_avx512f(auVar58,auVar46);
            auVar97._16_16_ = auVar89._16_16_;
            auVar97._0_16_ = auVar58;
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar40 * auVar47._0_4_ + (uint)!bVar40 * auVar58._0_4_;
            auVar47 = vmaxss_avx512f(auVar46,auVar57);
            auVar99._16_16_ = auVar89._16_16_;
            auVar99._0_16_ = auVar57;
            auVar98._4_28_ = auVar99._4_28_;
            auVar98._0_4_ = (uint)bVar40 * auVar47._0_4_ + (uint)!bVar40 * auVar57._0_4_;
            auVar47 = vmaxss_avx512f(auVar59,auVar96._0_16_);
            auVar53 = vminss_avx512f(auVar98._0_16_,auVar46);
            if (auVar47._0_4_ <= auVar53._0_4_) {
              auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
              auVar60 = vminss_avx512f(ZEXT416((uint)(auVar53._0_4_ + 0.1)),auVar46);
              auVar120._0_8_ = auVar134._0_8_;
              auVar120._8_8_ = auVar120._0_8_;
              auVar194._8_8_ = auVar155._0_8_;
              auVar194._0_8_ = auVar155._0_8_;
              auVar206._8_8_ = auVar61._0_8_;
              auVar206._0_8_ = auVar61._0_8_;
              auVar47 = vshufpd_avx(auVar155,auVar155,3);
              auVar53 = vshufpd_avx(auVar61,auVar61,3);
              auVar54 = vshufps_avx(auVar59,auVar60,0);
              auVar58 = vsubps_avx512vl(auVar44,auVar54);
              fVar191 = auVar54._0_4_;
              auVar148._0_4_ = fVar191 * auVar64._0_4_;
              fVar200 = auVar54._4_4_;
              auVar148._4_4_ = fVar200 * auVar64._4_4_;
              fVar201 = auVar54._8_4_;
              auVar148._8_4_ = fVar201 * auVar64._8_4_;
              fVar202 = auVar54._12_4_;
              auVar148._12_4_ = fVar202 * auVar64._12_4_;
              auVar156._0_4_ = fVar191 * auVar47._0_4_;
              auVar156._4_4_ = fVar200 * auVar47._4_4_;
              auVar156._8_4_ = fVar201 * auVar47._8_4_;
              auVar156._12_4_ = fVar202 * auVar47._12_4_;
              auVar230._0_4_ = auVar53._0_4_ * fVar191;
              auVar230._4_4_ = auVar53._4_4_ * fVar200;
              auVar230._8_4_ = auVar53._8_4_ * fVar201;
              auVar230._12_4_ = auVar53._12_4_ * fVar202;
              auVar138._0_4_ = fVar191 * auVar62._0_4_;
              auVar138._4_4_ = fVar200 * auVar62._4_4_;
              auVar138._8_4_ = fVar201 * auVar62._8_4_;
              auVar138._12_4_ = fVar202 * auVar62._12_4_;
              auVar64 = vfmadd231ps_fma(auVar148,auVar58,auVar120);
              auVar62 = vfmadd231ps_fma(auVar156,auVar58,auVar194);
              auVar57 = vfmadd231ps_fma(auVar230,auVar58,auVar206);
              auVar58 = vfmadd231ps_fma(auVar138,auVar58,ZEXT816(0));
              auVar53 = vsubss_avx512f(auVar46,auVar59);
              auVar47 = vmovshdup_avx(auVar43);
              auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar59._0_4_)),auVar43,
                                         auVar53);
              auVar53 = vsubss_avx512f(auVar46,auVar60);
              auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar60._0_4_)),auVar43,
                                        auVar53);
              auVar61 = vdivss_avx512f(auVar46,ZEXT416((uint)fVar100));
              auVar47 = vsubps_avx(auVar62,auVar64);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar53 = vmulps_avx512vl(auVar47,auVar59);
              auVar47 = vsubps_avx(auVar57,auVar62);
              auVar54 = vmulps_avx512vl(auVar47,auVar59);
              auVar47 = vsubps_avx(auVar58,auVar57);
              auVar47 = vmulps_avx512vl(auVar47,auVar59);
              auVar43 = vminps_avx(auVar54,auVar47);
              auVar47 = vmaxps_avx(auVar54,auVar47);
              auVar43 = vminps_avx(auVar53,auVar43);
              auVar47 = vmaxps_avx(auVar53,auVar47);
              auVar53 = vshufpd_avx(auVar43,auVar43,3);
              auVar54 = vshufpd_avx(auVar47,auVar47,3);
              auVar43 = vminps_avx(auVar43,auVar53);
              auVar47 = vmaxps_avx(auVar47,auVar54);
              fVar100 = auVar61._0_4_;
              auVar176._0_4_ = auVar43._0_4_ * fVar100;
              auVar176._4_4_ = auVar43._4_4_ * fVar100;
              auVar176._8_4_ = auVar43._8_4_ * fVar100;
              auVar176._12_4_ = auVar43._12_4_ * fVar100;
              auVar164._0_4_ = fVar100 * auVar47._0_4_;
              auVar164._4_4_ = fVar100 * auVar47._4_4_;
              auVar164._8_4_ = fVar100 * auVar47._8_4_;
              auVar164._12_4_ = fVar100 * auVar47._12_4_;
              auVar61 = vdivss_avx512f(auVar46,ZEXT416((uint)(auVar55._0_4_ - auVar134._0_4_)));
              auVar47 = vshufpd_avx(auVar64,auVar64,3);
              auVar43 = vshufpd_avx(auVar62,auVar62,3);
              auVar53 = vshufpd_avx(auVar57,auVar57,3);
              auVar54 = vshufpd_avx(auVar58,auVar58,3);
              auVar47 = vsubps_avx(auVar47,auVar64);
              auVar64 = vsubps_avx(auVar43,auVar62);
              auVar62 = vsubps_avx(auVar53,auVar57);
              auVar54 = vsubps_avx(auVar54,auVar58);
              auVar43 = vminps_avx(auVar47,auVar64);
              auVar47 = vmaxps_avx(auVar47,auVar64);
              auVar53 = vminps_avx(auVar62,auVar54);
              auVar53 = vminps_avx(auVar43,auVar53);
              auVar43 = vmaxps_avx(auVar62,auVar54);
              auVar47 = vmaxps_avx(auVar47,auVar43);
              fVar100 = auVar61._0_4_;
              auVar207._0_4_ = fVar100 * auVar53._0_4_;
              auVar207._4_4_ = fVar100 * auVar53._4_4_;
              auVar207._8_4_ = fVar100 * auVar53._8_4_;
              auVar207._12_4_ = fVar100 * auVar53._12_4_;
              auVar195._0_4_ = fVar100 * auVar47._0_4_;
              auVar195._4_4_ = fVar100 * auVar47._4_4_;
              auVar195._8_4_ = fVar100 * auVar47._8_4_;
              auVar195._12_4_ = fVar100 * auVar47._12_4_;
              auVar54 = vinsertps_avx(auVar51,auVar134,0x10);
              auVar56 = vpermt2ps_avx512vl(auVar51,_DAT_01feecd0,auVar55);
              auVar111._0_4_ = auVar54._0_4_ + auVar56._0_4_;
              auVar111._4_4_ = auVar54._4_4_ + auVar56._4_4_;
              auVar111._8_4_ = auVar54._8_4_ + auVar56._8_4_;
              auVar111._12_4_ = auVar54._12_4_ + auVar56._12_4_;
              auVar61 = vmulps_avx512vl(auVar111,auVar236._0_16_);
              auVar43 = vshufps_avx(auVar61,auVar61,0x54);
              uVar108 = auVar61._0_4_;
              auVar113._4_4_ = uVar108;
              auVar113._0_4_ = uVar108;
              auVar113._8_4_ = uVar108;
              auVar113._12_4_ = uVar108;
              auVar62 = vfmadd213ps_avx512vl(auVar41,auVar113,auVar3);
              auVar53 = vfmadd213ps_fma(auVar52,auVar113,local_328);
              auVar64 = vfmadd213ps_fma(local_198,auVar113,local_338);
              auVar47 = vsubps_avx(auVar53,auVar62);
              auVar62 = vfmadd213ps_fma(auVar47,auVar113,auVar62);
              auVar47 = vsubps_avx(auVar64,auVar53);
              auVar47 = vfmadd213ps_fma(auVar47,auVar113,auVar53);
              auVar47 = vsubps_avx(auVar47,auVar62);
              auVar53 = vfmadd231ps_fma(auVar62,auVar47,auVar113);
              auVar57 = vmulps_avx512vl(auVar47,auVar59);
              auVar216._8_8_ = auVar53._0_8_;
              auVar216._0_8_ = auVar53._0_8_;
              auVar47 = vshufpd_avx(auVar53,auVar53,3);
              auVar53 = vshufps_avx(auVar61,auVar61,0x55);
              auVar64 = vsubps_avx(auVar47,auVar216);
              auVar62 = vfmadd231ps_fma(auVar216,auVar53,auVar64);
              auVar231._8_8_ = auVar57._0_8_;
              auVar231._0_8_ = auVar57._0_8_;
              auVar47 = vshufpd_avx(auVar57,auVar57,3);
              auVar47 = vsubps_avx512vl(auVar47,auVar231);
              auVar47 = vfmadd213ps_avx512vl(auVar47,auVar53,auVar231);
              auVar114._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
              auVar114._8_4_ = auVar64._8_4_ ^ 0x80000000;
              auVar114._12_4_ = auVar64._12_4_ ^ 0x80000000;
              auVar53 = vmovshdup_avx512vl(auVar47);
              auVar232._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar53._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar53._12_4_ ^ 0x80000000;
              auVar57 = vmovshdup_avx512vl(auVar64);
              auVar58 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar64);
              auVar63 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar244 = ZEXT1664(auVar63);
              auVar53 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar64._0_4_)),auVar47,
                                            auVar57);
              auVar64 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar114);
              auVar139._0_4_ = auVar53._0_4_;
              auVar139._4_4_ = auVar139._0_4_;
              auVar139._8_4_ = auVar139._0_4_;
              auVar139._12_4_ = auVar139._0_4_;
              auVar47 = vdivps_avx(auVar58,auVar139);
              auVar65 = vdivps_avx512vl(auVar64,auVar139);
              fVar100 = auVar62._0_4_;
              auVar53 = vshufps_avx(auVar62,auVar62,0x55);
              auVar217._0_4_ = fVar100 * auVar47._0_4_ + auVar53._0_4_ * auVar65._0_4_;
              auVar217._4_4_ = fVar100 * auVar47._4_4_ + auVar53._4_4_ * auVar65._4_4_;
              auVar217._8_4_ = fVar100 * auVar47._8_4_ + auVar53._8_4_ * auVar65._8_4_;
              auVar217._12_4_ = fVar100 * auVar47._12_4_ + auVar53._12_4_ * auVar65._12_4_;
              auVar59 = vsubps_avx(auVar43,auVar217);
              auVar53 = vmovshdup_avx(auVar47);
              auVar43 = vinsertps_avx(auVar176,auVar207,0x1c);
              auVar233._0_4_ = auVar53._0_4_ * auVar43._0_4_;
              auVar233._4_4_ = auVar53._4_4_ * auVar43._4_4_;
              auVar233._8_4_ = auVar53._8_4_ * auVar43._8_4_;
              auVar233._12_4_ = auVar53._12_4_ * auVar43._12_4_;
              auVar60 = vinsertps_avx512f(auVar164,auVar195,0x1c);
              auVar53 = vmulps_avx512vl(auVar53,auVar60);
              auVar58 = vminps_avx512vl(auVar233,auVar53);
              auVar62 = vmaxps_avx(auVar53,auVar233);
              auVar57 = vmovshdup_avx(auVar65);
              auVar53 = vinsertps_avx(auVar207,auVar176,0x4c);
              auVar208._0_4_ = auVar57._0_4_ * auVar53._0_4_;
              auVar208._4_4_ = auVar57._4_4_ * auVar53._4_4_;
              auVar208._8_4_ = auVar57._8_4_ * auVar53._8_4_;
              auVar208._12_4_ = auVar57._12_4_ * auVar53._12_4_;
              auVar64 = vinsertps_avx(auVar195,auVar164,0x4c);
              auVar196._0_4_ = auVar57._0_4_ * auVar64._0_4_;
              auVar196._4_4_ = auVar57._4_4_ * auVar64._4_4_;
              auVar196._8_4_ = auVar57._8_4_ * auVar64._8_4_;
              auVar196._12_4_ = auVar57._12_4_ * auVar64._12_4_;
              auVar57 = vminps_avx(auVar208,auVar196);
              auVar58 = vaddps_avx512vl(auVar58,auVar57);
              auVar57 = vmaxps_avx(auVar196,auVar208);
              auVar197._0_4_ = auVar62._0_4_ + auVar57._0_4_;
              auVar197._4_4_ = auVar62._4_4_ + auVar57._4_4_;
              auVar197._8_4_ = auVar62._8_4_ + auVar57._8_4_;
              auVar197._12_4_ = auVar62._12_4_ + auVar57._12_4_;
              auVar209._8_8_ = 0x3f80000000000000;
              auVar209._0_8_ = 0x3f80000000000000;
              auVar62 = vsubps_avx(auVar209,auVar197);
              auVar57 = vsubps_avx(auVar209,auVar58);
              auVar58 = vsubps_avx(auVar54,auVar61);
              auVar61 = vsubps_avx(auVar56,auVar61);
              fVar202 = auVar58._0_4_;
              auVar234._0_4_ = fVar202 * auVar62._0_4_;
              fVar212 = auVar58._4_4_;
              auVar234._4_4_ = fVar212 * auVar62._4_4_;
              fVar213 = auVar58._8_4_;
              auVar234._8_4_ = fVar213 * auVar62._8_4_;
              fVar214 = auVar58._12_4_;
              auVar234._12_4_ = fVar214 * auVar62._12_4_;
              auVar66 = vbroadcastss_avx512vl(auVar47);
              auVar43 = vmulps_avx512vl(auVar66,auVar43);
              auVar60 = vmulps_avx512vl(auVar66,auVar60);
              auVar66 = vminps_avx512vl(auVar43,auVar60);
              auVar60 = vmaxps_avx512vl(auVar60,auVar43);
              auVar43 = vbroadcastss_avx512vl(auVar65);
              auVar53 = vmulps_avx512vl(auVar43,auVar53);
              auVar43 = vmulps_avx512vl(auVar43,auVar64);
              auVar64 = vminps_avx512vl(auVar53,auVar43);
              auVar64 = vaddps_avx512vl(auVar66,auVar64);
              auVar58 = vmulps_avx512vl(auVar58,auVar57);
              fVar100 = auVar61._0_4_;
              auVar198._0_4_ = fVar100 * auVar62._0_4_;
              fVar191 = auVar61._4_4_;
              auVar198._4_4_ = fVar191 * auVar62._4_4_;
              fVar200 = auVar61._8_4_;
              auVar198._8_4_ = fVar200 * auVar62._8_4_;
              fVar201 = auVar61._12_4_;
              auVar198._12_4_ = fVar201 * auVar62._12_4_;
              auVar210._0_4_ = fVar100 * auVar57._0_4_;
              auVar210._4_4_ = fVar191 * auVar57._4_4_;
              auVar210._8_4_ = fVar200 * auVar57._8_4_;
              auVar210._12_4_ = fVar201 * auVar57._12_4_;
              auVar43 = vmaxps_avx(auVar43,auVar53);
              auVar165._0_4_ = auVar60._0_4_ + auVar43._0_4_;
              auVar165._4_4_ = auVar60._4_4_ + auVar43._4_4_;
              auVar165._8_4_ = auVar60._8_4_ + auVar43._8_4_;
              auVar165._12_4_ = auVar60._12_4_ + auVar43._12_4_;
              auVar177._8_8_ = 0x3f800000;
              auVar177._0_8_ = 0x3f800000;
              auVar43 = vsubps_avx(auVar177,auVar165);
              auVar53 = vsubps_avx512vl(auVar177,auVar64);
              auVar228._0_4_ = fVar202 * auVar43._0_4_;
              auVar228._4_4_ = fVar212 * auVar43._4_4_;
              auVar228._8_4_ = fVar213 * auVar43._8_4_;
              auVar228._12_4_ = fVar214 * auVar43._12_4_;
              auVar218._0_4_ = fVar202 * auVar53._0_4_;
              auVar218._4_4_ = fVar212 * auVar53._4_4_;
              auVar218._8_4_ = fVar213 * auVar53._8_4_;
              auVar218._12_4_ = fVar214 * auVar53._12_4_;
              auVar166._0_4_ = fVar100 * auVar43._0_4_;
              auVar166._4_4_ = fVar191 * auVar43._4_4_;
              auVar166._8_4_ = fVar200 * auVar43._8_4_;
              auVar166._12_4_ = fVar201 * auVar43._12_4_;
              auVar178._0_4_ = fVar100 * auVar53._0_4_;
              auVar178._4_4_ = fVar191 * auVar53._4_4_;
              auVar178._8_4_ = fVar200 * auVar53._8_4_;
              auVar178._12_4_ = fVar201 * auVar53._12_4_;
              auVar43 = vminps_avx(auVar228,auVar218);
              auVar53 = vminps_avx512vl(auVar166,auVar178);
              auVar64 = vminps_avx512vl(auVar43,auVar53);
              auVar43 = vmaxps_avx(auVar218,auVar228);
              auVar53 = vmaxps_avx(auVar178,auVar166);
              auVar53 = vmaxps_avx(auVar53,auVar43);
              auVar62 = vminps_avx512vl(auVar234,auVar58);
              auVar43 = vminps_avx(auVar198,auVar210);
              auVar43 = vminps_avx(auVar62,auVar43);
              auVar43 = vhaddps_avx(auVar64,auVar43);
              auVar62 = vmaxps_avx512vl(auVar58,auVar234);
              auVar64 = vmaxps_avx(auVar210,auVar198);
              auVar64 = vmaxps_avx(auVar64,auVar62);
              auVar53 = vhaddps_avx(auVar53,auVar64);
              auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
              auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
              auVar167._0_4_ = auVar43._0_4_ + auVar59._0_4_;
              auVar167._4_4_ = auVar43._4_4_ + auVar59._4_4_;
              auVar167._8_4_ = auVar43._8_4_ + auVar59._8_4_;
              auVar167._12_4_ = auVar43._12_4_ + auVar59._12_4_;
              auVar179._0_4_ = auVar53._0_4_ + auVar59._0_4_;
              auVar179._4_4_ = auVar53._4_4_ + auVar59._4_4_;
              auVar179._8_4_ = auVar53._8_4_ + auVar59._8_4_;
              auVar179._12_4_ = auVar53._12_4_ + auVar59._12_4_;
              auVar43 = vmaxps_avx(auVar54,auVar167);
              auVar53 = vminps_avx(auVar179,auVar56);
              uVar36 = vcmpps_avx512vl(auVar53,auVar43,1);
              if ((uVar36 & 3) == 0) {
                uVar36 = vcmpps_avx512vl(auVar179,auVar56,1);
                uVar12 = vcmpps_avx512vl(auVar51,auVar167,1);
                if (((ushort)uVar12 & (ushort)uVar36 & 1) == 0) {
                  bVar27 = 0;
                }
                else {
                  auVar43 = vmovshdup_avx(auVar167);
                  bVar27 = auVar134._0_4_ < auVar43._0_4_ & (byte)(uVar36 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar29 || uVar7 != 0 && !bVar39) | bVar27) != 1) {
                  auVar43 = vinsertps_avx(auVar134,auVar55,0x10);
                  goto LAB_01cc8ad5;
                }
                lVar31 = 200;
                do {
                  auVar51 = vsubss_avx512f(auVar46,auVar59);
                  fVar200 = auVar51._0_4_;
                  fVar100 = fVar200 * fVar200 * fVar200;
                  fVar201 = auVar59._0_4_;
                  fVar191 = fVar201 * 3.0 * fVar200 * fVar200;
                  fVar200 = fVar200 * fVar201 * fVar201 * 3.0;
                  auVar126._4_4_ = fVar100;
                  auVar126._0_4_ = fVar100;
                  auVar126._8_4_ = fVar100;
                  auVar126._12_4_ = fVar100;
                  auVar121._4_4_ = fVar191;
                  auVar121._0_4_ = fVar191;
                  auVar121._8_4_ = fVar191;
                  auVar121._12_4_ = fVar191;
                  auVar102._4_4_ = fVar200;
                  auVar102._0_4_ = fVar200;
                  auVar102._8_4_ = fVar200;
                  auVar102._12_4_ = fVar200;
                  fVar201 = fVar201 * fVar201 * fVar201;
                  auVar149._0_4_ = fVar201 * (float)local_178._0_4_;
                  auVar149._4_4_ = fVar201 * (float)local_178._4_4_;
                  auVar149._8_4_ = fVar201 * fStack_170;
                  auVar149._12_4_ = fVar201 * fStack_16c;
                  auVar51 = vfmadd231ps_fma(auVar149,local_338,auVar102);
                  auVar51 = vfmadd231ps_fma(auVar51,local_328,auVar121);
                  auVar51 = vfmadd231ps_fma(auVar51,auVar3,auVar126);
                  auVar103._8_8_ = auVar51._0_8_;
                  auVar103._0_8_ = auVar51._0_8_;
                  auVar51 = vshufpd_avx(auVar51,auVar51,3);
                  auVar43 = vshufps_avx(auVar59,auVar59,0x55);
                  auVar51 = vsubps_avx(auVar51,auVar103);
                  auVar43 = vfmadd213ps_fma(auVar51,auVar43,auVar103);
                  fVar100 = auVar43._0_4_;
                  auVar51 = vshufps_avx(auVar43,auVar43,0x55);
                  auVar104._0_4_ = auVar47._0_4_ * fVar100 + auVar65._0_4_ * auVar51._0_4_;
                  auVar104._4_4_ = auVar47._4_4_ * fVar100 + auVar65._4_4_ * auVar51._4_4_;
                  auVar104._8_4_ = auVar47._8_4_ * fVar100 + auVar65._8_4_ * auVar51._8_4_;
                  auVar104._12_4_ = auVar47._12_4_ * fVar100 + auVar65._12_4_ * auVar51._12_4_;
                  auVar59 = vsubps_avx(auVar59,auVar104);
                  auVar51 = vandps_avx512vl(auVar43,auVar237._0_16_);
                  auVar43 = vprolq_avx512vl(auVar51,0x20);
                  auVar51 = vmaxss_avx(auVar43,auVar51);
                  bVar39 = (float)local_188._0_4_ < auVar51._0_4_;
                  if (auVar51._0_4_ < (float)local_188._0_4_) {
                    auVar51 = vucomiss_avx512f(auVar63);
                    if (bVar39) break;
                    auVar47 = vucomiss_avx512f(auVar51);
                    auVar245 = ZEXT1664(auVar47);
                    if (bVar39) break;
                    vmovshdup_avx(auVar51);
                    auVar47 = vucomiss_avx512f(auVar63);
                    if (bVar39) break;
                    auVar43 = vucomiss_avx512f(auVar47);
                    auVar245 = ZEXT1664(auVar43);
                    if (bVar39) break;
                    auVar46 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar61 = vinsertps_avx(auVar46,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar46 = vdpps_avx(auVar61,local_1a8,0x7f);
                    auVar53 = vdpps_avx(auVar61,local_1b8,0x7f);
                    auVar54 = vdpps_avx(auVar61,local_1c8,0x7f);
                    auVar64 = vdpps_avx(auVar61,local_1d8,0x7f);
                    auVar62 = vdpps_avx(auVar61,local_1e8,0x7f);
                    auVar57 = vdpps_avx(auVar61,local_1f8,0x7f);
                    auVar58 = vdpps_avx(auVar61,local_208,0x7f);
                    auVar61 = vdpps_avx(auVar61,local_218,0x7f);
                    auVar59 = vsubss_avx512f(auVar43,auVar47);
                    fVar201 = auVar47._0_4_;
                    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar62._0_4_)),auVar59,
                                              auVar46);
                    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar201)),auVar59,
                                              auVar53);
                    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar201)),auVar59,
                                              auVar54);
                    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar61._0_4_)),auVar59,
                                              auVar64);
                    auVar43 = vsubss_avx512f(auVar43,auVar51);
                    auVar180._0_4_ = auVar43._0_4_;
                    fVar100 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                    local_d8 = auVar51._0_4_;
                    fVar191 = local_d8 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                    fVar200 = auVar180._0_4_ * local_d8 * local_d8 * 3.0;
                    fVar212 = local_d8 * local_d8 * local_d8;
                    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar54._0_4_)),
                                              ZEXT416((uint)fVar200),auVar53);
                    auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar191),auVar46);
                    auVar47 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar100),auVar47);
                    fVar202 = auVar47._0_4_;
                    if ((fVar202 < fVar118) ||
                       (fVar213 = *(float *)(ray + k * 4 + 0x80), fVar213 < fVar202)) break;
                    local_c8 = vshufps_avx(auVar51,auVar51,0x55);
                    auVar44 = vsubps_avx512vl(auVar44,local_c8);
                    fVar214 = local_c8._0_4_;
                    auVar185._0_4_ = fVar214 * (float)local_238._0_4_;
                    fVar215 = local_c8._4_4_;
                    auVar185._4_4_ = fVar215 * (float)local_238._4_4_;
                    fVar222 = local_c8._8_4_;
                    auVar185._8_4_ = fVar222 * fStack_230;
                    fVar223 = local_c8._12_4_;
                    auVar185._12_4_ = fVar223 * fStack_22c;
                    auVar199._0_4_ = fVar214 * (float)local_288._0_4_;
                    auVar199._4_4_ = fVar215 * (float)local_288._4_4_;
                    auVar199._8_4_ = fVar222 * fStack_280;
                    auVar199._12_4_ = fVar223 * fStack_27c;
                    auVar211._0_4_ = fVar214 * (float)local_298._0_4_;
                    auVar211._4_4_ = fVar215 * (float)local_298._4_4_;
                    auVar211._8_4_ = fVar222 * fStack_290;
                    auVar211._12_4_ = fVar223 * fStack_28c;
                    auVar219._0_4_ = fVar214 * (float)local_258._0_4_;
                    auVar219._4_4_ = fVar215 * (float)local_258._4_4_;
                    auVar219._8_4_ = fVar222 * fStack_250;
                    auVar219._12_4_ = fVar223 * fStack_24c;
                    auVar51 = vfmadd231ps_fma(auVar185,auVar44,local_228);
                    auVar47 = vfmadd231ps_fma(auVar199,auVar44,local_268);
                    auVar43 = vfmadd231ps_fma(auVar211,auVar44,local_278);
                    auVar44 = vfmadd231ps_fma(auVar219,auVar44,local_248);
                    auVar51 = vsubps_avx(auVar47,auVar51);
                    auVar47 = vsubps_avx(auVar43,auVar47);
                    auVar43 = vsubps_avx(auVar44,auVar43);
                    auVar220._0_4_ = local_d8 * auVar47._0_4_;
                    auVar220._4_4_ = local_d8 * auVar47._4_4_;
                    auVar220._8_4_ = local_d8 * auVar47._8_4_;
                    auVar220._12_4_ = local_d8 * auVar47._12_4_;
                    auVar180._4_4_ = auVar180._0_4_;
                    auVar180._8_4_ = auVar180._0_4_;
                    auVar180._12_4_ = auVar180._0_4_;
                    auVar51 = vfmadd231ps_fma(auVar220,auVar180,auVar51);
                    auVar186._0_4_ = local_d8 * auVar43._0_4_;
                    auVar186._4_4_ = local_d8 * auVar43._4_4_;
                    auVar186._8_4_ = local_d8 * auVar43._8_4_;
                    auVar186._12_4_ = local_d8 * auVar43._12_4_;
                    auVar47 = vfmadd231ps_fma(auVar186,auVar180,auVar47);
                    auVar187._0_4_ = local_d8 * auVar47._0_4_;
                    auVar187._4_4_ = local_d8 * auVar47._4_4_;
                    auVar187._8_4_ = local_d8 * auVar47._8_4_;
                    auVar187._12_4_ = local_d8 * auVar47._12_4_;
                    auVar51 = vfmadd231ps_fma(auVar187,auVar180,auVar51);
                    auVar16._8_4_ = 0x40400000;
                    auVar16._0_8_ = 0x4040000040400000;
                    auVar16._12_4_ = 0x40400000;
                    auVar51 = vmulps_avx512vl(auVar51,auVar16);
                    pGVar8 = (context->scene->geometries).items[uVar34].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    auVar157._0_4_ = fVar212 * (float)local_2d8._0_4_;
                    auVar157._4_4_ = fVar212 * (float)local_2d8._4_4_;
                    auVar157._8_4_ = fVar212 * fStack_2d0;
                    auVar157._12_4_ = fVar212 * fStack_2cc;
                    auVar150._4_4_ = fVar200;
                    auVar150._0_4_ = fVar200;
                    auVar150._8_4_ = fVar200;
                    auVar150._12_4_ = fVar200;
                    auVar47 = vfmadd132ps_fma(auVar150,auVar157,local_2c8);
                    auVar140._4_4_ = fVar191;
                    auVar140._0_4_ = fVar191;
                    auVar140._8_4_ = fVar191;
                    auVar140._12_4_ = fVar191;
                    auVar47 = vfmadd132ps_fma(auVar140,auVar47,local_2b8);
                    auVar127._4_4_ = fVar100;
                    auVar127._0_4_ = fVar100;
                    auVar127._8_4_ = fVar100;
                    auVar127._12_4_ = fVar100;
                    auVar44 = vfmadd132ps_fma(auVar127,auVar47,local_2a8);
                    auVar47 = vshufps_avx(auVar44,auVar44,0xc9);
                    auVar43 = vshufps_avx(auVar51,auVar51,0xc9);
                    auVar128._0_4_ = auVar44._0_4_ * auVar43._0_4_;
                    auVar128._4_4_ = auVar44._4_4_ * auVar43._4_4_;
                    auVar128._8_4_ = auVar44._8_4_ * auVar43._8_4_;
                    auVar128._12_4_ = auVar44._12_4_ * auVar43._12_4_;
                    auVar51 = vfmsub231ps_fma(auVar128,auVar51,auVar47);
                    local_e8 = auVar51._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar202;
                      uVar108 = vextractps_avx(auVar51,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar108;
                      uVar108 = vextractps_avx(auVar51,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar108;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                      *(float *)(ray + k * 4 + 0xf0) = local_d8;
                      *(float *)(ray + k * 4 + 0x100) = fVar201;
                      *(uint *)(ray + k * 4 + 0x110) = uVar6;
                      *(uint *)(ray + k * 4 + 0x120) = uVar34;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    auVar47 = vshufps_avx(auVar51,auVar51,0x55);
                    local_f8 = vshufps_avx(auVar51,auVar51,0xaa);
                    local_108[0] = (RTCHitN)auVar47[0];
                    local_108[1] = (RTCHitN)auVar47[1];
                    local_108[2] = (RTCHitN)auVar47[2];
                    local_108[3] = (RTCHitN)auVar47[3];
                    local_108[4] = (RTCHitN)auVar47[4];
                    local_108[5] = (RTCHitN)auVar47[5];
                    local_108[6] = (RTCHitN)auVar47[6];
                    local_108[7] = (RTCHitN)auVar47[7];
                    local_108[8] = (RTCHitN)auVar47[8];
                    local_108[9] = (RTCHitN)auVar47[9];
                    local_108[10] = (RTCHitN)auVar47[10];
                    local_108[0xb] = (RTCHitN)auVar47[0xb];
                    local_108[0xc] = (RTCHitN)auVar47[0xc];
                    local_108[0xd] = (RTCHitN)auVar47[0xd];
                    local_108[0xe] = (RTCHitN)auVar47[0xe];
                    local_108[0xf] = (RTCHitN)auVar47[0xf];
                    uStack_e4 = local_e8;
                    uStack_e0 = local_e8;
                    uStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_b8 = local_2f8._0_8_;
                    uStack_b0 = local_2f8._8_8_;
                    local_a8 = local_2e8;
                    vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                    uStack_94 = context->user->instID[0];
                    local_98 = uStack_94;
                    uStack_90 = uStack_94;
                    uStack_8c = uStack_94;
                    uStack_88 = context->user->instPrimID[0];
                    uStack_84 = uStack_88;
                    uStack_80 = uStack_88;
                    uStack_7c = uStack_88;
                    *(float *)(ray + k * 4 + 0x80) = fVar202;
                    local_378 = local_308;
                    local_368.valid = (int *)local_378;
                    local_368.geometryUserPtr = pGVar8->userPtr;
                    local_368.context = context->user;
                    local_368.hit = local_108;
                    local_368.N = 4;
                    local_368.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_368);
                      auVar51 = vxorps_avx512vl(auVar63,auVar63);
                      auVar244 = ZEXT1664(auVar51);
                      auVar245 = ZEXT464(0x3f800000);
                      auVar242 = ZEXT3264(_DAT_01feed20);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar241 = ZEXT1664(auVar51);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar240 = ZEXT1664(auVar51);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar239 = ZEXT3264(auVar72);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar238 = ZEXT1664(auVar51);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar237 = ZEXT1664(auVar51);
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar236 = ZEXT1664(auVar51);
                      auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar243 = ZEXT3264(auVar72);
                    }
                    auVar51 = auVar244._0_16_;
                    uVar36 = vptestmd_avx512vl(local_378,local_378);
                    if ((uVar36 & 0xf) != 0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_368);
                        auVar51 = vxorps_avx512vl(auVar51,auVar51);
                        auVar244 = ZEXT1664(auVar51);
                        auVar245 = ZEXT464(0x3f800000);
                        auVar242 = ZEXT3264(_DAT_01feed20);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar241 = ZEXT1664(auVar51);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar240 = ZEXT1664(auVar51);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar239 = ZEXT3264(auVar72);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar238 = ZEXT1664(auVar51);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar237 = ZEXT1664(auVar51);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar236 = ZEXT1664(auVar51);
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar243 = ZEXT3264(auVar72);
                      }
                      uVar36 = vptestmd_avx512vl(local_378,local_378);
                      uVar36 = uVar36 & 0xf;
                      bVar27 = (byte)uVar36;
                      if (bVar27 != 0) {
                        iVar24 = *(int *)(local_368.hit + 4);
                        iVar25 = *(int *)(local_368.hit + 8);
                        iVar26 = *(int *)(local_368.hit + 0xc);
                        bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar37 = SUB81(uVar36 >> 3,0);
                        *(uint *)(local_368.ray + 0xc0) =
                             (uint)(bVar27 & 1) * *(int *)local_368.hit |
                             (uint)!(bool)(bVar27 & 1) * *(int *)(local_368.ray + 0xc0);
                        *(uint *)(local_368.ray + 0xc4) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_368.ray + 0xc4);
                        *(uint *)(local_368.ray + 200) =
                             (uint)bVar40 * iVar25 | (uint)!bVar40 * *(int *)(local_368.ray + 200);
                        *(uint *)(local_368.ray + 0xcc) =
                             (uint)bVar37 * iVar26 | (uint)!bVar37 * *(int *)(local_368.ray + 0xcc);
                        iVar24 = *(int *)(local_368.hit + 0x14);
                        iVar25 = *(int *)(local_368.hit + 0x18);
                        iVar26 = *(int *)(local_368.hit + 0x1c);
                        bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar37 = SUB81(uVar36 >> 3,0);
                        *(uint *)(local_368.ray + 0xd0) =
                             (uint)(bVar27 & 1) * *(int *)(local_368.hit + 0x10) |
                             (uint)!(bool)(bVar27 & 1) * *(int *)(local_368.ray + 0xd0);
                        *(uint *)(local_368.ray + 0xd4) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_368.ray + 0xd4);
                        *(uint *)(local_368.ray + 0xd8) =
                             (uint)bVar40 * iVar25 | (uint)!bVar40 * *(int *)(local_368.ray + 0xd8);
                        *(uint *)(local_368.ray + 0xdc) =
                             (uint)bVar37 * iVar26 | (uint)!bVar37 * *(int *)(local_368.ray + 0xdc);
                        iVar24 = *(int *)(local_368.hit + 0x24);
                        iVar25 = *(int *)(local_368.hit + 0x28);
                        iVar26 = *(int *)(local_368.hit + 0x2c);
                        bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar37 = SUB81(uVar36 >> 3,0);
                        *(uint *)(local_368.ray + 0xe0) =
                             (uint)(bVar27 & 1) * *(int *)(local_368.hit + 0x20) |
                             (uint)!(bool)(bVar27 & 1) * *(int *)(local_368.ray + 0xe0);
                        *(uint *)(local_368.ray + 0xe4) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_368.ray + 0xe4);
                        *(uint *)(local_368.ray + 0xe8) =
                             (uint)bVar40 * iVar25 | (uint)!bVar40 * *(int *)(local_368.ray + 0xe8);
                        *(uint *)(local_368.ray + 0xec) =
                             (uint)bVar37 * iVar26 | (uint)!bVar37 * *(int *)(local_368.ray + 0xec);
                        iVar24 = *(int *)(local_368.hit + 0x34);
                        iVar25 = *(int *)(local_368.hit + 0x38);
                        iVar26 = *(int *)(local_368.hit + 0x3c);
                        bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar37 = SUB81(uVar36 >> 3,0);
                        *(uint *)(local_368.ray + 0xf0) =
                             (uint)(bVar27 & 1) * *(int *)(local_368.hit + 0x30) |
                             (uint)!(bool)(bVar27 & 1) * *(int *)(local_368.ray + 0xf0);
                        *(uint *)(local_368.ray + 0xf4) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_368.ray + 0xf4);
                        *(uint *)(local_368.ray + 0xf8) =
                             (uint)bVar40 * iVar25 | (uint)!bVar40 * *(int *)(local_368.ray + 0xf8);
                        *(uint *)(local_368.ray + 0xfc) =
                             (uint)bVar37 * iVar26 | (uint)!bVar37 * *(int *)(local_368.ray + 0xfc);
                        iVar24 = *(int *)(local_368.hit + 0x44);
                        iVar25 = *(int *)(local_368.hit + 0x48);
                        iVar26 = *(int *)(local_368.hit + 0x4c);
                        bVar39 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar37 = SUB81(uVar36 >> 3,0);
                        *(uint *)(local_368.ray + 0x100) =
                             (uint)(bVar27 & 1) * *(int *)(local_368.hit + 0x40) |
                             (uint)!(bool)(bVar27 & 1) * *(int *)(local_368.ray + 0x100);
                        *(uint *)(local_368.ray + 0x104) =
                             (uint)bVar39 * iVar24 | (uint)!bVar39 * *(int *)(local_368.ray + 0x104)
                        ;
                        *(uint *)(local_368.ray + 0x108) =
                             (uint)bVar40 * iVar25 | (uint)!bVar40 * *(int *)(local_368.ray + 0x108)
                        ;
                        *(uint *)(local_368.ray + 0x10c) =
                             (uint)bVar37 * iVar26 | (uint)!bVar37 * *(int *)(local_368.ray + 0x10c)
                        ;
                        auVar51 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_368.hit + 0x50));
                        *(undefined1 (*) [16])(local_368.ray + 0x110) = auVar51;
                        auVar51 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_368.hit + 0x60));
                        *(undefined1 (*) [16])(local_368.ray + 0x120) = auVar51;
                        auVar51 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_368.hit + 0x70));
                        *(undefined1 (*) [16])(local_368.ray + 0x130) = auVar51;
                        auVar51 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_368.hit + 0x80));
                        *(undefined1 (*) [16])(local_368.ray + 0x140) = auVar51;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar213;
                    break;
                  }
                  lVar31 = lVar31 + -1;
                } while (lVar31 != 0);
              }
            }
          }
          if ((uint)uVar29 == 0) break;
        } while( true );
      }
      uVar108 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar17._4_4_ = uVar108;
      auVar17._0_4_ = uVar108;
      auVar17._8_4_ = uVar108;
      auVar17._12_4_ = uVar108;
      auVar17._16_4_ = uVar108;
      auVar17._20_4_ = uVar108;
      auVar17._24_4_ = uVar108;
      auVar17._28_4_ = uVar108;
      uVar12 = vcmpps_avx512vl(local_78,auVar17,2);
      uVar34 = (uint)uVar35 & (uint)uVar12;
      uVar35 = (ulong)uVar34;
    } while (uVar34 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }